

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_hn<embree::avx::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  undefined8 *puVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  long lVar11;
  __int_type_conflict _Var12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined8 uVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  uint uVar63;
  uint uVar64;
  ulong uVar65;
  long lVar66;
  ulong uVar67;
  ulong uVar68;
  uint uVar69;
  uint uVar70;
  long lVar71;
  bool bVar72;
  vint4 bi_1;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar92 [16];
  undefined1 auVar108 [32];
  undefined1 auVar93 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  vint4 bi;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar150;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar127 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar151;
  float fVar183;
  float fVar184;
  vint4 bi_2;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar185;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar186;
  float fVar204;
  float fVar205;
  vint4 ai_1;
  undefined1 auVar187 [16];
  float fVar206;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  float fVar207;
  float fVar229;
  float fVar230;
  vint4 ai_2;
  undefined1 auVar208 [16];
  float fVar231;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  float fVar232;
  float fVar250;
  float fVar251;
  undefined1 auVar233 [16];
  float fVar252;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  vfloat4 b0;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar264 [16];
  vint4 ai;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [32];
  vfloat4 a0_1;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [32];
  float fVar300;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  float fVar302;
  float fVar303;
  float fVar304;
  undefined1 auVar298 [32];
  float fVar301;
  undefined1 auVar299 [32];
  float fVar305;
  float fVar312;
  float fVar313;
  undefined1 auVar306 [16];
  float fVar314;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [32];
  float fVar315;
  float fVar323;
  float fVar324;
  undefined1 auVar316 [16];
  float fVar325;
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [32];
  float fVar326;
  float fVar331;
  float fVar332;
  undefined1 auVar327 [16];
  float fVar333;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar344;
  float fVar345;
  undefined1 auVar339 [16];
  float fVar346;
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  float fVar347;
  float fVar348;
  float fVar355;
  float fVar356;
  float fVar357;
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  float fVar358;
  float fVar359;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  vfloat4 a0;
  float fVar366;
  undefined1 auVar360 [16];
  float fVar367;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  undefined1 local_5c8 [8];
  float fStack_5c0;
  float fStack_5bc;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  undefined1 local_568 [8];
  float fStack_560;
  float fStack_55c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  undefined1 local_528 [8];
  float fStack_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined1 local_448 [16];
  undefined1 (*local_438) [16];
  Primitive *local_430;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  uint auStack_3b8 [4];
  RTCFilterFunctionNArguments local_3a8;
  undefined1 local_378 [32];
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [32];
  float afStack_208 [8];
  RTCHitN local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  undefined1 local_158 [32];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar263 [32];
  undefined1 auVar354 [32];
  
  PVar6 = prim[1];
  uVar65 = (ulong)(byte)PVar6;
  lVar66 = uVar65 * 0x25;
  fVar151 = *(float *)(prim + lVar66 + 0x12);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar84 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar83 = vsubps_avx(auVar83,*(undefined1 (*) [16])(prim + lVar66 + 6));
  auVar114._0_4_ = fVar151 * auVar83._0_4_;
  auVar114._4_4_ = fVar151 * auVar83._4_4_;
  auVar114._8_4_ = fVar151 * auVar83._8_4_;
  auVar114._12_4_ = fVar151 * auVar83._12_4_;
  auVar265._0_4_ = fVar151 * auVar84._0_4_;
  auVar265._4_4_ = fVar151 * auVar84._4_4_;
  auVar265._8_4_ = fVar151 * auVar84._8_4_;
  auVar265._12_4_ = fVar151 * auVar84._12_4_;
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 4 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 5 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar178 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 6 + 6)));
  auVar178 = vcvtdq2ps_avx(auVar178);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0xf + 6)));
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar122 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar65 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar140 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1a + 6)));
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar129 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1b + 6)));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1c + 6)));
  auVar168 = vcvtdq2ps_avx(auVar168);
  auVar130 = vshufps_avx(auVar265,auVar265,0);
  auVar264 = vshufps_avx(auVar265,auVar265,0x55);
  auVar16 = vshufps_avx(auVar265,auVar265,0xaa);
  fVar151 = auVar16._0_4_;
  fVar183 = auVar16._4_4_;
  fVar184 = auVar16._8_4_;
  fVar185 = auVar16._12_4_;
  fVar207 = auVar264._0_4_;
  fVar229 = auVar264._4_4_;
  fVar230 = auVar264._8_4_;
  fVar231 = auVar264._12_4_;
  fVar186 = auVar130._0_4_;
  fVar204 = auVar130._4_4_;
  fVar205 = auVar130._8_4_;
  fVar206 = auVar130._12_4_;
  auVar327._0_4_ = fVar186 * auVar83._0_4_ + fVar207 * auVar84._0_4_ + fVar151 * auVar178._0_4_;
  auVar327._4_4_ = fVar204 * auVar83._4_4_ + fVar229 * auVar84._4_4_ + fVar183 * auVar178._4_4_;
  auVar327._8_4_ = fVar205 * auVar83._8_4_ + fVar230 * auVar84._8_4_ + fVar184 * auVar178._8_4_;
  auVar327._12_4_ = fVar206 * auVar83._12_4_ + fVar231 * auVar84._12_4_ + fVar185 * auVar178._12_4_;
  auVar339._0_4_ = fVar186 * auVar14._0_4_ + fVar207 * auVar15._0_4_ + auVar122._0_4_ * fVar151;
  auVar339._4_4_ = fVar204 * auVar14._4_4_ + fVar229 * auVar15._4_4_ + auVar122._4_4_ * fVar183;
  auVar339._8_4_ = fVar205 * auVar14._8_4_ + fVar230 * auVar15._8_4_ + auVar122._8_4_ * fVar184;
  auVar339._12_4_ = fVar206 * auVar14._12_4_ + fVar231 * auVar15._12_4_ + auVar122._12_4_ * fVar185;
  auVar266._0_4_ = fVar186 * auVar140._0_4_ + fVar207 * auVar129._0_4_ + auVar168._0_4_ * fVar151;
  auVar266._4_4_ = fVar204 * auVar140._4_4_ + fVar229 * auVar129._4_4_ + auVar168._4_4_ * fVar183;
  auVar266._8_4_ = fVar205 * auVar140._8_4_ + fVar230 * auVar129._8_4_ + auVar168._8_4_ * fVar184;
  auVar266._12_4_ =
       fVar206 * auVar140._12_4_ + fVar231 * auVar129._12_4_ + auVar168._12_4_ * fVar185;
  auVar130 = vshufps_avx(auVar114,auVar114,0);
  auVar264 = vshufps_avx(auVar114,auVar114,0x55);
  auVar16 = vshufps_avx(auVar114,auVar114,0xaa);
  fVar151 = auVar16._0_4_;
  fVar183 = auVar16._4_4_;
  fVar184 = auVar16._8_4_;
  fVar185 = auVar16._12_4_;
  fVar207 = auVar264._0_4_;
  fVar229 = auVar264._4_4_;
  fVar230 = auVar264._8_4_;
  fVar231 = auVar264._12_4_;
  fVar186 = auVar130._0_4_;
  fVar204 = auVar130._4_4_;
  fVar205 = auVar130._8_4_;
  fVar206 = auVar130._12_4_;
  auVar115._0_4_ = fVar186 * auVar83._0_4_ + fVar207 * auVar84._0_4_ + fVar151 * auVar178._0_4_;
  auVar115._4_4_ = fVar204 * auVar83._4_4_ + fVar229 * auVar84._4_4_ + fVar183 * auVar178._4_4_;
  auVar115._8_4_ = fVar205 * auVar83._8_4_ + fVar230 * auVar84._8_4_ + fVar184 * auVar178._8_4_;
  auVar115._12_4_ = fVar206 * auVar83._12_4_ + fVar231 * auVar84._12_4_ + fVar185 * auVar178._12_4_;
  auVar73._0_4_ = fVar186 * auVar14._0_4_ + auVar122._0_4_ * fVar151 + fVar207 * auVar15._0_4_;
  auVar73._4_4_ = fVar204 * auVar14._4_4_ + auVar122._4_4_ * fVar183 + fVar229 * auVar15._4_4_;
  auVar73._8_4_ = fVar205 * auVar14._8_4_ + auVar122._8_4_ * fVar184 + fVar230 * auVar15._8_4_;
  auVar73._12_4_ = fVar206 * auVar14._12_4_ + auVar122._12_4_ * fVar185 + fVar231 * auVar15._12_4_;
  auVar275._8_4_ = 0x7fffffff;
  auVar275._0_8_ = 0x7fffffff7fffffff;
  auVar275._12_4_ = 0x7fffffff;
  auVar83 = vandps_avx(auVar327,auVar275);
  auVar208._8_4_ = 0x219392ef;
  auVar208._0_8_ = 0x219392ef219392ef;
  auVar208._12_4_ = 0x219392ef;
  auVar83 = vcmpps_avx(auVar83,auVar208,1);
  auVar84 = vblendvps_avx(auVar327,auVar208,auVar83);
  auVar83 = vandps_avx(auVar339,auVar275);
  auVar83 = vcmpps_avx(auVar83,auVar208,1);
  auVar178 = vblendvps_avx(auVar339,auVar208,auVar83);
  auVar83 = vandps_avx(auVar275,auVar266);
  auVar83 = vcmpps_avx(auVar83,auVar208,1);
  auVar83 = vblendvps_avx(auVar266,auVar208,auVar83);
  auVar152._0_4_ = fVar186 * auVar140._0_4_ + fVar207 * auVar129._0_4_ + auVar168._0_4_ * fVar151;
  auVar152._4_4_ = fVar204 * auVar140._4_4_ + fVar229 * auVar129._4_4_ + auVar168._4_4_ * fVar183;
  auVar152._8_4_ = fVar205 * auVar140._8_4_ + fVar230 * auVar129._8_4_ + auVar168._8_4_ * fVar184;
  auVar152._12_4_ =
       fVar206 * auVar140._12_4_ + fVar231 * auVar129._12_4_ + auVar168._12_4_ * fVar185;
  auVar14 = vrcpps_avx(auVar84);
  fVar186 = auVar14._0_4_;
  auVar187._0_4_ = fVar186 * auVar84._0_4_;
  fVar204 = auVar14._4_4_;
  auVar187._4_4_ = fVar204 * auVar84._4_4_;
  fVar205 = auVar14._8_4_;
  auVar187._8_4_ = fVar205 * auVar84._8_4_;
  fVar206 = auVar14._12_4_;
  auVar187._12_4_ = fVar206 * auVar84._12_4_;
  auVar276._8_4_ = 0x3f800000;
  auVar276._0_8_ = 0x3f8000003f800000;
  auVar276._12_4_ = 0x3f800000;
  auVar84 = vsubps_avx(auVar276,auVar187);
  fVar186 = fVar186 + fVar186 * auVar84._0_4_;
  fVar204 = fVar204 + fVar204 * auVar84._4_4_;
  fVar205 = fVar205 + fVar205 * auVar84._8_4_;
  fVar206 = fVar206 + fVar206 * auVar84._12_4_;
  auVar84 = vrcpps_avx(auVar178);
  fVar207 = auVar84._0_4_;
  auVar233._0_4_ = fVar207 * auVar178._0_4_;
  fVar229 = auVar84._4_4_;
  auVar233._4_4_ = fVar229 * auVar178._4_4_;
  fVar230 = auVar84._8_4_;
  auVar233._8_4_ = fVar230 * auVar178._8_4_;
  fVar231 = auVar84._12_4_;
  auVar233._12_4_ = fVar231 * auVar178._12_4_;
  auVar84 = vsubps_avx(auVar276,auVar233);
  fVar207 = fVar207 + fVar207 * auVar84._0_4_;
  fVar229 = fVar229 + fVar229 * auVar84._4_4_;
  fVar230 = fVar230 + fVar230 * auVar84._8_4_;
  fVar231 = fVar231 + fVar231 * auVar84._12_4_;
  auVar84 = vrcpps_avx(auVar83);
  fVar232 = auVar84._0_4_;
  auVar253._0_4_ = fVar232 * auVar83._0_4_;
  fVar250 = auVar84._4_4_;
  auVar253._4_4_ = fVar250 * auVar83._4_4_;
  fVar251 = auVar84._8_4_;
  auVar253._8_4_ = fVar251 * auVar83._8_4_;
  fVar252 = auVar84._12_4_;
  auVar253._12_4_ = fVar252 * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar276,auVar253);
  fVar232 = fVar232 + fVar232 * auVar83._0_4_;
  fVar250 = fVar250 + fVar250 * auVar83._4_4_;
  fVar251 = fVar251 + fVar251 * auVar83._8_4_;
  fVar252 = fVar252 + fVar252 * auVar83._12_4_;
  auVar83 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar66 + 0x16)) *
                          *(float *)(prim + lVar66 + 0x1a)));
  auVar178 = vshufps_avx(auVar83,auVar83,0);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar65 * 7 + 6);
  auVar83 = vpmovsxwd_avx(auVar83);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar65 * 0xb + 6);
  auVar84 = vpmovsxwd_avx(auVar84);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar14 = vsubps_avx(auVar84,auVar83);
  fVar151 = auVar178._0_4_;
  fVar183 = auVar178._4_4_;
  fVar184 = auVar178._8_4_;
  fVar185 = auVar178._12_4_;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = *(ulong *)(prim + uVar65 * 9 + 6);
  auVar84 = vpmovsxwd_avx(auVar178);
  auVar267._0_4_ = auVar14._0_4_ * fVar151 + auVar83._0_4_;
  auVar267._4_4_ = auVar14._4_4_ * fVar183 + auVar83._4_4_;
  auVar267._8_4_ = auVar14._8_4_ * fVar184 + auVar83._8_4_;
  auVar267._12_4_ = auVar14._12_4_ * fVar185 + auVar83._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar65 * 0xd + 6);
  auVar178 = vpmovsxwd_avx(auVar14);
  auVar83 = vcvtdq2ps_avx(auVar84);
  auVar84 = vcvtdq2ps_avx(auVar178);
  auVar84 = vsubps_avx(auVar84,auVar83);
  auVar277._0_4_ = auVar84._0_4_ * fVar151 + auVar83._0_4_;
  auVar277._4_4_ = auVar84._4_4_ * fVar183 + auVar83._4_4_;
  auVar277._8_4_ = auVar84._8_4_ * fVar184 + auVar83._8_4_;
  auVar277._12_4_ = auVar84._12_4_ * fVar185 + auVar83._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar65 * 0x12 + 6);
  auVar83 = vpmovsxwd_avx(auVar15);
  uVar67 = (ulong)(uint)((int)(uVar65 * 5) << 2);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = *(ulong *)(prim + uVar65 * 2 + uVar67 + 6);
  auVar84 = vpmovsxwd_avx(auVar122);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar83);
  auVar290._0_4_ = auVar84._0_4_ * fVar151 + auVar83._0_4_;
  auVar290._4_4_ = auVar84._4_4_ * fVar183 + auVar83._4_4_;
  auVar290._8_4_ = auVar84._8_4_ * fVar184 + auVar83._8_4_;
  auVar290._12_4_ = auVar84._12_4_ * fVar185 + auVar83._12_4_;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(prim + uVar67 + 6);
  auVar83 = vpmovsxwd_avx(auVar140);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar129._8_8_ = 0;
  auVar129._0_8_ = *(ulong *)(prim + uVar65 * 0x18 + 6);
  auVar84 = vpmovsxwd_avx(auVar129);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar178 = vsubps_avx(auVar84,auVar83);
  auVar168._8_8_ = 0;
  auVar168._0_8_ = *(ulong *)(prim + uVar65 * 0x1d + 6);
  auVar84 = vpmovsxwd_avx(auVar168);
  auVar306._0_4_ = auVar178._0_4_ * fVar151 + auVar83._0_4_;
  auVar306._4_4_ = auVar178._4_4_ * fVar183 + auVar83._4_4_;
  auVar306._8_4_ = auVar178._8_4_ * fVar184 + auVar83._8_4_;
  auVar306._12_4_ = auVar178._12_4_ * fVar185 + auVar83._12_4_;
  auVar83 = vcvtdq2ps_avx(auVar84);
  auVar130._8_8_ = 0;
  auVar130._0_8_ = *(ulong *)(prim + uVar65 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar84 = vpmovsxwd_avx(auVar130);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar83);
  auVar316._0_4_ = auVar84._0_4_ * fVar151 + auVar83._0_4_;
  auVar316._4_4_ = auVar84._4_4_ * fVar183 + auVar83._4_4_;
  auVar316._8_4_ = auVar84._8_4_ * fVar184 + auVar83._8_4_;
  auVar316._12_4_ = auVar84._12_4_ * fVar185 + auVar83._12_4_;
  auVar264._8_8_ = 0;
  auVar264._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar65) + 6);
  auVar83 = vpmovsxwd_avx(auVar264);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar65 * 0x23 + 6);
  auVar84 = vpmovsxwd_avx(auVar16);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar83);
  auVar254._0_4_ = auVar83._0_4_ + auVar84._0_4_ * fVar151;
  auVar254._4_4_ = auVar83._4_4_ + auVar84._4_4_ * fVar183;
  auVar254._8_4_ = auVar83._8_4_ + auVar84._8_4_ * fVar184;
  auVar254._12_4_ = auVar83._12_4_ + auVar84._12_4_ * fVar185;
  auVar83 = vsubps_avx(auVar267,auVar115);
  auVar268._0_4_ = fVar186 * auVar83._0_4_;
  auVar268._4_4_ = fVar204 * auVar83._4_4_;
  auVar268._8_4_ = fVar205 * auVar83._8_4_;
  auVar268._12_4_ = fVar206 * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar277,auVar115);
  auVar116._0_4_ = fVar186 * auVar83._0_4_;
  auVar116._4_4_ = fVar204 * auVar83._4_4_;
  auVar116._8_4_ = fVar205 * auVar83._8_4_;
  auVar116._12_4_ = fVar206 * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar290,auVar73);
  auVar188._0_4_ = fVar207 * auVar83._0_4_;
  auVar188._4_4_ = fVar229 * auVar83._4_4_;
  auVar188._8_4_ = fVar230 * auVar83._8_4_;
  auVar188._12_4_ = fVar231 * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar306,auVar73);
  auVar74._0_4_ = fVar207 * auVar83._0_4_;
  auVar74._4_4_ = fVar229 * auVar83._4_4_;
  auVar74._8_4_ = fVar230 * auVar83._8_4_;
  auVar74._12_4_ = fVar231 * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar316,auVar152);
  auVar209._0_4_ = fVar232 * auVar83._0_4_;
  auVar209._4_4_ = fVar250 * auVar83._4_4_;
  auVar209._8_4_ = fVar251 * auVar83._8_4_;
  auVar209._12_4_ = fVar252 * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar254,auVar152);
  auVar153._0_4_ = fVar232 * auVar83._0_4_;
  auVar153._4_4_ = fVar250 * auVar83._4_4_;
  auVar153._8_4_ = fVar251 * auVar83._8_4_;
  auVar153._12_4_ = fVar252 * auVar83._12_4_;
  auVar83 = vpminsd_avx(auVar268,auVar116);
  auVar84 = vpminsd_avx(auVar188,auVar74);
  auVar83 = vmaxps_avx(auVar83,auVar84);
  auVar84 = vpminsd_avx(auVar209,auVar153);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar278._4_4_ = uVar4;
  auVar278._0_4_ = uVar4;
  auVar278._8_4_ = uVar4;
  auVar278._12_4_ = uVar4;
  auVar84 = vmaxps_avx(auVar84,auVar278);
  auVar83 = vmaxps_avx(auVar83,auVar84);
  local_2f8._0_4_ = auVar83._0_4_ * 0.99999964;
  local_2f8._4_4_ = auVar83._4_4_ * 0.99999964;
  local_2f8._8_4_ = auVar83._8_4_ * 0.99999964;
  local_2f8._12_4_ = auVar83._12_4_ * 0.99999964;
  auVar83 = vpmaxsd_avx(auVar268,auVar116);
  auVar84 = vpmaxsd_avx(auVar188,auVar74);
  auVar83 = vminps_avx(auVar83,auVar84);
  auVar84 = vpmaxsd_avx(auVar209,auVar153);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar154._4_4_ = uVar4;
  auVar154._0_4_ = uVar4;
  auVar154._8_4_ = uVar4;
  auVar154._12_4_ = uVar4;
  auVar84 = vminps_avx(auVar84,auVar154);
  auVar83 = vminps_avx(auVar83,auVar84);
  auVar75._0_4_ = auVar83._0_4_ * 1.0000004;
  auVar75._4_4_ = auVar83._4_4_ * 1.0000004;
  auVar75._8_4_ = auVar83._8_4_ * 1.0000004;
  auVar75._12_4_ = auVar83._12_4_ * 1.0000004;
  auVar83 = vpshufd_avx(ZEXT116((byte)PVar6),0);
  auVar84 = vpcmpgtd_avx(auVar83,_DAT_01f7fcf0);
  auVar83 = vcmpps_avx(local_2f8,auVar75,2);
  auVar83 = vandps_avx(auVar83,auVar84);
  uVar63 = vmovmskps_avx(auVar83);
  if (uVar63 == 0) {
    uVar65 = 0;
LAB_00f8a047:
    return (bool)((byte)uVar65 & 1);
  }
  uVar63 = uVar63 & 0xff;
  auVar108._16_16_ = mm_lookupmask_ps._240_16_;
  auVar108._0_16_ = mm_lookupmask_ps._240_16_;
  local_158 = vblendps_avx(auVar108,ZEXT832(0) << 0x20,0x80);
  local_438 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_430 = prim;
LAB_00f87ce7:
  lVar66 = 0;
  if (uVar63 != 0) {
    for (; (uVar63 >> lVar66 & 1) == 0; lVar66 = lVar66 + 1) {
    }
  }
  uVar64 = *(uint *)(local_430 + 2);
  uVar69 = *(uint *)(local_430 + lVar66 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar64].ptr;
  fVar151 = (pGVar7->time_range).lower;
  fVar207 = pGVar7->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar151) / ((pGVar7->time_range).upper - fVar151));
  auVar83 = vroundss_avx(ZEXT416((uint)fVar207),ZEXT416((uint)fVar207),9);
  auVar83 = vminss_avx(auVar83,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar178 = vmaxss_avx(ZEXT816(0) << 0x20,auVar83);
  uVar65 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)uVar69 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar71 = (long)(int)auVar178._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + 0x10 + lVar71);
  pfVar1 = (float *)(*(long *)(_Var8 + lVar71) + lVar9 * uVar65);
  fVar229 = *pfVar1;
  fVar230 = pfVar1[1];
  fVar231 = pfVar1[2];
  fVar232 = pfVar1[3];
  lVar66 = uVar65 + 1;
  auVar83 = *(undefined1 (*) [16])(*(long *)(_Var8 + lVar71) + lVar9 * lVar66);
  p_Var10 = pGVar7[4].occlusionFilterN;
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar9 + 0x10 + lVar71);
  pfVar1 = (float *)(*(long *)(lVar9 + lVar71) + lVar11 * uVar65);
  fVar250 = *pfVar1;
  fVar251 = pfVar1[1];
  fVar252 = pfVar1[2];
  fVar150 = pfVar1[3];
  _Var12 = pGVar7[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(*(long *)(p_Var10 + lVar71) + *(long *)(p_Var10 + lVar71 + 0x10) * uVar65);
  pfVar2 = (float *)(*(long *)(p_Var10 + lVar71) + *(long *)(p_Var10 + lVar71 + 0x10) * lVar66);
  auVar269._0_4_ = *pfVar2 * 0.33333334;
  auVar269._4_4_ = pfVar2[1] * 0.33333334;
  auVar269._8_4_ = pfVar2[2] * 0.33333334;
  auVar269._12_4_ = pfVar2[3] * 0.33333334;
  lVar13 = *(long *)(_Var12 + 0x10 + lVar71);
  pfVar2 = (float *)(*(long *)(_Var12 + lVar71) + lVar13 * uVar65);
  auVar84 = *(undefined1 (*) [16])(*(long *)(lVar9 + lVar71) + lVar11 * lVar66);
  fVar207 = fVar207 - auVar178._0_4_;
  fVar315 = fVar229 + *pfVar1 * 0.33333334;
  fVar323 = fVar230 + pfVar1[1] * 0.33333334;
  fVar324 = fVar231 + pfVar1[2] * 0.33333334;
  fVar325 = fVar232 + pfVar1[3] * 0.33333334;
  auVar178 = vsubps_avx(auVar83,auVar269);
  fVar305 = *pfVar2 * 0.33333334 + fVar250;
  fVar312 = pfVar2[1] * 0.33333334 + fVar251;
  fVar313 = pfVar2[2] * 0.33333334 + fVar252;
  fVar314 = pfVar2[3] * 0.33333334 + fVar150;
  pfVar1 = (float *)(*(long *)(_Var12 + lVar71) + lVar13 * lVar66);
  auVar76._0_4_ = *pfVar1 * 0.33333334;
  auVar76._4_4_ = pfVar1[1] * 0.33333334;
  auVar76._8_4_ = pfVar1[2] * 0.33333334;
  auVar76._12_4_ = pfVar1[3] * 0.33333334;
  auVar14 = vsubps_avx(auVar84,auVar76);
  fVar151 = auVar83._0_4_;
  fVar184 = auVar83._4_4_;
  fVar186 = auVar83._8_4_;
  fVar205 = auVar83._12_4_;
  fVar326 = auVar178._0_4_ * 0.0;
  fVar331 = auVar178._4_4_ * 0.0;
  fVar332 = auVar178._8_4_ * 0.0;
  fVar333 = auVar178._12_4_ * 0.0;
  fVar348 = fVar326 + fVar151 * 0.0;
  fVar355 = fVar331 + fVar184 * 0.0;
  fVar356 = fVar332 + fVar186 * 0.0;
  fVar357 = fVar333 + fVar205 * 0.0;
  auVar77._0_4_ = fVar348 + fVar315 * 3.0;
  auVar77._4_4_ = fVar355 + fVar323 * 3.0;
  auVar77._8_4_ = fVar356 + fVar324 * 3.0;
  auVar77._12_4_ = fVar357 + fVar325 * 3.0;
  auVar117._0_4_ = fVar229 * 3.0;
  auVar117._4_4_ = fVar230 * 3.0;
  auVar117._8_4_ = fVar231 * 3.0;
  auVar117._12_4_ = fVar232 * 3.0;
  auVar168 = vsubps_avx(auVar77,auVar117);
  fVar183 = auVar84._0_4_;
  fVar185 = auVar84._4_4_;
  fVar204 = auVar84._8_4_;
  fVar206 = auVar84._12_4_;
  fVar338 = auVar14._0_4_ * 0.0;
  fVar344 = auVar14._4_4_ * 0.0;
  fVar345 = auVar14._8_4_ * 0.0;
  fVar346 = auVar14._12_4_ * 0.0;
  fVar358 = fVar338 + fVar183 * 0.0;
  fVar361 = fVar344 + fVar185 * 0.0;
  fVar363 = fVar345 + fVar204 * 0.0;
  fVar366 = fVar346 + fVar206 * 0.0;
  auVar78._0_4_ = fVar358 + fVar305 * 3.0;
  auVar78._4_4_ = fVar361 + fVar312 * 3.0;
  auVar78._8_4_ = fVar363 + fVar313 * 3.0;
  auVar78._12_4_ = fVar366 + fVar314 * 3.0;
  auVar279._0_4_ = fVar250 * 3.0;
  auVar279._4_4_ = fVar251 * 3.0;
  auVar279._8_4_ = fVar252 * 3.0;
  auVar279._12_4_ = fVar150 * 3.0;
  auVar15 = vsubps_avx(auVar78,auVar279);
  lVar11 = *(long *)(_Var8 + 0x38 + lVar71);
  lVar13 = *(long *)(_Var8 + 0x48 + lVar71);
  puVar3 = (undefined8 *)(lVar11 + lVar13 * uVar65);
  uVar5 = *puVar3;
  uVar55 = puVar3[1];
  fVar315 = fVar315 * 0.0;
  fVar323 = fVar323 * 0.0;
  fVar324 = fVar324 * 0.0;
  fVar325 = fVar325 * 0.0;
  auVar317._0_4_ = fVar348 + fVar315 + fVar229;
  auVar317._4_4_ = fVar355 + fVar323 + fVar230;
  auVar317._8_4_ = fVar356 + fVar324 + fVar231;
  auVar317._12_4_ = fVar357 + fVar325 + fVar232;
  fVar305 = fVar305 * 0.0;
  fVar312 = fVar312 * 0.0;
  fVar313 = fVar313 * 0.0;
  fVar314 = fVar314 * 0.0;
  auVar360._0_4_ = fVar305 + fVar358 + fVar250;
  auVar360._4_4_ = fVar312 + fVar361 + fVar251;
  auVar360._8_4_ = fVar313 + fVar363 + fVar252;
  auVar360._12_4_ = fVar314 + fVar366 + fVar150;
  auVar155._0_4_ = fVar229 * 0.0;
  auVar155._4_4_ = fVar230 * 0.0;
  auVar155._8_4_ = fVar231 * 0.0;
  auVar155._12_4_ = fVar232 * 0.0;
  auVar307._0_4_ = fVar326 + fVar151 + fVar315 + auVar155._0_4_;
  auVar307._4_4_ = fVar331 + fVar184 + fVar323 + auVar155._4_4_;
  auVar307._8_4_ = fVar332 + fVar186 + fVar324 + auVar155._8_4_;
  auVar307._12_4_ = fVar333 + fVar205 + fVar325 + auVar155._12_4_;
  auVar189._0_4_ = fVar151 * 3.0;
  auVar189._4_4_ = fVar184 * 3.0;
  auVar189._8_4_ = fVar186 * 3.0;
  auVar189._12_4_ = fVar205 * 3.0;
  auVar270._0_4_ = auVar178._0_4_ * 3.0;
  auVar270._4_4_ = auVar178._4_4_ * 3.0;
  auVar270._8_4_ = auVar178._8_4_ * 3.0;
  auVar270._12_4_ = auVar178._12_4_ * 3.0;
  auVar83 = vsubps_avx(auVar189,auVar270);
  auVar79._0_4_ = fVar315 + auVar83._0_4_;
  auVar79._4_4_ = fVar323 + auVar83._4_4_;
  auVar79._8_4_ = fVar324 + auVar83._8_4_;
  auVar79._12_4_ = fVar325 + auVar83._12_4_;
  auVar130 = vsubps_avx(auVar79,auVar155);
  auVar156._0_4_ = fVar250 * 0.0;
  auVar156._4_4_ = fVar251 * 0.0;
  auVar156._8_4_ = fVar252 * 0.0;
  auVar156._12_4_ = fVar150 * 0.0;
  auVar80._0_4_ = auVar156._0_4_ + fVar305 + fVar338 + fVar183;
  auVar80._4_4_ = auVar156._4_4_ + fVar312 + fVar344 + fVar185;
  auVar80._8_4_ = auVar156._8_4_ + fVar313 + fVar345 + fVar204;
  auVar80._12_4_ = auVar156._12_4_ + fVar314 + fVar346 + fVar206;
  auVar190._0_4_ = fVar183 * 3.0;
  auVar190._4_4_ = fVar185 * 3.0;
  auVar190._8_4_ = fVar204 * 3.0;
  auVar190._12_4_ = fVar206 * 3.0;
  auVar210._0_4_ = auVar14._0_4_ * 3.0;
  auVar210._4_4_ = auVar14._4_4_ * 3.0;
  auVar210._8_4_ = auVar14._8_4_ * 3.0;
  auVar210._12_4_ = auVar14._12_4_ * 3.0;
  auVar83 = vsubps_avx(auVar190,auVar210);
  auVar191._0_4_ = fVar305 + auVar83._0_4_;
  auVar191._4_4_ = fVar312 + auVar83._4_4_;
  auVar191._8_4_ = fVar313 + auVar83._8_4_;
  auVar191._12_4_ = fVar314 + auVar83._12_4_;
  auVar122 = vsubps_avx(auVar191,auVar156);
  auVar83 = vshufps_avx(auVar168,auVar168,0xc9);
  auVar84 = vshufps_avx(auVar360,auVar360,0xc9);
  fVar229 = auVar168._0_4_;
  auVar211._0_4_ = fVar229 * auVar84._0_4_;
  fVar231 = auVar168._4_4_;
  auVar211._4_4_ = fVar231 * auVar84._4_4_;
  fVar251 = auVar168._8_4_;
  auVar211._8_4_ = fVar251 * auVar84._8_4_;
  fVar252 = auVar168._12_4_;
  auVar211._12_4_ = fVar252 * auVar84._12_4_;
  auVar234._0_4_ = auVar360._0_4_ * auVar83._0_4_;
  auVar234._4_4_ = auVar360._4_4_ * auVar83._4_4_;
  auVar234._8_4_ = auVar360._8_4_ * auVar83._8_4_;
  auVar234._12_4_ = auVar360._12_4_ * auVar83._12_4_;
  auVar84 = vsubps_avx(auVar234,auVar211);
  auVar178 = vshufps_avx(auVar84,auVar84,0xc9);
  auVar84 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar235._0_4_ = fVar229 * auVar84._0_4_;
  auVar235._4_4_ = fVar231 * auVar84._4_4_;
  auVar235._8_4_ = fVar251 * auVar84._8_4_;
  auVar235._12_4_ = fVar252 * auVar84._12_4_;
  auVar157._0_4_ = auVar15._0_4_ * auVar83._0_4_;
  auVar157._4_4_ = auVar15._4_4_ * auVar83._4_4_;
  auVar157._8_4_ = auVar15._8_4_ * auVar83._8_4_;
  auVar157._12_4_ = auVar15._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar157,auVar235);
  auVar14 = vshufps_avx(auVar83,auVar83,0xc9);
  auVar83 = vshufps_avx(auVar130,auVar130,0xc9);
  auVar84 = vshufps_avx(auVar80,auVar80,0xc9);
  fVar348 = auVar130._0_4_;
  auVar158._0_4_ = fVar348 * auVar84._0_4_;
  fVar355 = auVar130._4_4_;
  auVar158._4_4_ = fVar355 * auVar84._4_4_;
  fVar356 = auVar130._8_4_;
  auVar158._8_4_ = fVar356 * auVar84._8_4_;
  fVar357 = auVar130._12_4_;
  auVar158._12_4_ = fVar357 * auVar84._12_4_;
  auVar81._0_4_ = auVar83._0_4_ * auVar80._0_4_;
  auVar81._4_4_ = auVar83._4_4_ * auVar80._4_4_;
  auVar81._8_4_ = auVar83._8_4_ * auVar80._8_4_;
  auVar81._12_4_ = auVar83._12_4_ * auVar80._12_4_;
  auVar84 = vsubps_avx(auVar81,auVar158);
  auVar15 = vshufps_avx(auVar84,auVar84,0xc9);
  auVar84 = vshufps_avx(auVar122,auVar122,0xc9);
  auVar82._0_4_ = fVar348 * auVar84._0_4_;
  auVar82._4_4_ = fVar355 * auVar84._4_4_;
  auVar82._8_4_ = fVar356 * auVar84._8_4_;
  auVar82._12_4_ = fVar357 * auVar84._12_4_;
  auVar192._0_4_ = auVar83._0_4_ * auVar122._0_4_;
  auVar192._4_4_ = auVar83._4_4_ * auVar122._4_4_;
  auVar192._8_4_ = auVar83._8_4_ * auVar122._8_4_;
  auVar192._12_4_ = auVar83._12_4_ * auVar122._12_4_;
  auVar83 = vdpps_avx(auVar178,auVar178,0x7f);
  auVar84 = vsubps_avx(auVar192,auVar82);
  auVar122 = vshufps_avx(auVar84,auVar84,0xc9);
  fVar183 = auVar83._0_4_;
  auVar129 = ZEXT416((uint)fVar183);
  auVar84 = vrsqrtss_avx(auVar129,auVar129);
  fVar151 = auVar84._0_4_;
  auVar84 = ZEXT416((uint)(fVar151 * 1.5 - fVar183 * 0.5 * fVar151 * fVar151 * fVar151));
  auVar140 = vshufps_avx(auVar84,auVar84,0);
  fVar186 = auVar140._0_4_ * auVar178._0_4_;
  fVar204 = auVar140._4_4_ * auVar178._4_4_;
  fVar205 = auVar140._8_4_ * auVar178._8_4_;
  fVar206 = auVar140._12_4_ * auVar178._12_4_;
  auVar84 = vdpps_avx(auVar178,auVar14,0x7f);
  auVar83 = vshufps_avx(auVar83,auVar83,0);
  auVar236._0_4_ = auVar83._0_4_ * auVar14._0_4_;
  auVar236._4_4_ = auVar83._4_4_ * auVar14._4_4_;
  auVar236._8_4_ = auVar83._8_4_ * auVar14._8_4_;
  auVar236._12_4_ = auVar83._12_4_ * auVar14._12_4_;
  auVar83 = vshufps_avx(auVar84,auVar84,0);
  auVar212._0_4_ = auVar83._0_4_ * auVar178._0_4_;
  auVar212._4_4_ = auVar83._4_4_ * auVar178._4_4_;
  auVar212._8_4_ = auVar83._8_4_ * auVar178._8_4_;
  auVar212._12_4_ = auVar83._12_4_ * auVar178._12_4_;
  auVar264 = vsubps_avx(auVar236,auVar212);
  auVar83 = vrcpss_avx(auVar129,auVar129);
  auVar83 = ZEXT416((uint)(auVar83._0_4_ * (2.0 - fVar183 * auVar83._0_4_)));
  auVar129 = vshufps_avx(auVar83,auVar83,0);
  auVar178 = vdpps_avx(auVar15,auVar15,0x7f);
  auVar84 = vblendps_avx(auVar178,_DAT_01f7aa10,0xe);
  auVar83 = vrsqrtss_avx(auVar84,auVar84);
  fVar151 = auVar83._0_4_;
  auVar14 = vdpps_avx(auVar15,auVar122,0x7f);
  auVar83 = vshufps_avx(auVar178,auVar178,0);
  auVar255._0_4_ = auVar83._0_4_ * auVar122._0_4_;
  auVar255._4_4_ = auVar83._4_4_ * auVar122._4_4_;
  auVar255._8_4_ = auVar83._8_4_ * auVar122._8_4_;
  auVar255._12_4_ = auVar83._12_4_ * auVar122._12_4_;
  auVar83 = *(undefined1 (*) [16])(lVar11 + lVar13 * lVar66);
  pfVar1 = (float *)(*(long *)(p_Var10 + lVar71 + 0x38) +
                    *(long *)(p_Var10 + lVar71 + 0x48) * uVar65);
  auVar122 = ZEXT416((uint)(fVar151 * 1.5 - auVar178._0_4_ * 0.5 * fVar151 * fVar151 * fVar151));
  auVar122 = vshufps_avx(auVar122,auVar122,0);
  auVar14 = vshufps_avx(auVar14,auVar14,0);
  auVar280._0_4_ = auVar14._0_4_ * auVar15._0_4_;
  auVar280._4_4_ = auVar14._4_4_ * auVar15._4_4_;
  auVar280._8_4_ = auVar14._8_4_ * auVar15._8_4_;
  auVar280._12_4_ = auVar14._12_4_ * auVar15._12_4_;
  fVar151 = auVar15._0_4_ * auVar122._0_4_;
  fVar183 = auVar15._4_4_ * auVar122._4_4_;
  fVar184 = auVar15._8_4_ * auVar122._8_4_;
  fVar185 = auVar15._12_4_ * auVar122._12_4_;
  auVar15 = vsubps_avx(auVar255,auVar280);
  auVar84 = vrcpss_avx(auVar84,auVar84);
  auVar84 = ZEXT416((uint)(auVar84._0_4_ * (2.0 - auVar178._0_4_ * auVar84._0_4_)));
  auVar84 = vshufps_avx(auVar84,auVar84,0);
  auVar178 = vshufps_avx(auVar317,auVar317,0xff);
  auVar271._0_4_ = auVar178._0_4_ * fVar186;
  auVar271._4_4_ = auVar178._4_4_ * fVar204;
  auVar271._8_4_ = auVar178._8_4_ * fVar205;
  auVar271._12_4_ = auVar178._12_4_ * fVar206;
  auVar16 = vsubps_avx(auVar317,auVar271);
  auVar14 = vshufps_avx(auVar168,auVar168,0xff);
  auVar193._0_4_ =
       auVar14._0_4_ * fVar186 + auVar178._0_4_ * auVar140._0_4_ * auVar129._0_4_ * auVar264._0_4_;
  auVar193._4_4_ =
       auVar14._4_4_ * fVar204 + auVar178._4_4_ * auVar140._4_4_ * auVar129._4_4_ * auVar264._4_4_;
  auVar193._8_4_ =
       auVar14._8_4_ * fVar205 + auVar178._8_4_ * auVar140._8_4_ * auVar129._8_4_ * auVar264._8_4_;
  auVar193._12_4_ =
       auVar14._12_4_ * fVar206 +
       auVar178._12_4_ * auVar140._12_4_ * auVar129._12_4_ * auVar264._12_4_;
  auVar140 = vsubps_avx(auVar168,auVar193);
  auVar178 = vshufps_avx(auVar307,auVar307,0xff);
  auVar237._0_4_ = auVar178._0_4_ * fVar151;
  auVar237._4_4_ = auVar178._4_4_ * fVar183;
  auVar237._8_4_ = auVar178._8_4_ * fVar184;
  auVar237._12_4_ = auVar178._12_4_ * fVar185;
  auVar129 = vsubps_avx(auVar307,auVar237);
  auVar14 = vshufps_avx(auVar130,auVar130,0xff);
  auVar85._0_4_ =
       auVar14._0_4_ * fVar151 + auVar178._0_4_ * auVar122._0_4_ * auVar15._0_4_ * auVar84._0_4_;
  auVar85._4_4_ =
       auVar14._4_4_ * fVar183 + auVar178._4_4_ * auVar122._4_4_ * auVar15._4_4_ * auVar84._4_4_;
  auVar85._8_4_ =
       auVar14._8_4_ * fVar184 + auVar178._8_4_ * auVar122._8_4_ * auVar15._8_4_ * auVar84._8_4_;
  auVar85._12_4_ =
       auVar14._12_4_ * fVar185 +
       auVar178._12_4_ * auVar122._12_4_ * auVar15._12_4_ * auVar84._12_4_;
  auVar168 = vsubps_avx(auVar130,auVar85);
  local_568._4_4_ = auVar307._4_4_ + auVar237._4_4_;
  local_568._0_4_ = auVar307._0_4_ + auVar237._0_4_;
  fStack_560 = auVar307._8_4_ + auVar237._8_4_;
  fStack_55c = auVar307._12_4_ + auVar237._12_4_;
  local_5d8 = (float)uVar5;
  fStack_5d4 = (float)((ulong)uVar5 >> 0x20);
  fStack_5d0 = (float)uVar55;
  fStack_5cc = (float)((ulong)uVar55 >> 0x20);
  fVar338 = local_5d8 + *pfVar1 * 0.33333334;
  fVar344 = fStack_5d4 + pfVar1[1] * 0.33333334;
  fVar345 = fStack_5d0 + pfVar1[2] * 0.33333334;
  fVar346 = fStack_5cc + pfVar1[3] * 0.33333334;
  pfVar1 = (float *)(*(long *)(p_Var10 + lVar71 + 0x38) +
                    *(long *)(p_Var10 + lVar71 + 0x48) * lVar66);
  auVar86._0_4_ = *pfVar1 * 0.33333334;
  auVar86._4_4_ = pfVar1[1] * 0.33333334;
  auVar86._8_4_ = pfVar1[2] * 0.33333334;
  auVar86._12_4_ = pfVar1[3] * 0.33333334;
  auVar84 = vsubps_avx(auVar83,auVar86);
  fVar358 = auVar83._0_4_;
  fVar361 = auVar83._4_4_;
  fVar363 = auVar83._8_4_;
  fVar366 = auVar83._12_4_;
  fVar326 = auVar84._0_4_ * 0.0;
  fVar331 = auVar84._4_4_ * 0.0;
  fVar332 = auVar84._8_4_ * 0.0;
  fVar333 = auVar84._12_4_ * 0.0;
  fVar359 = fVar358 * 0.0 + fVar326;
  fVar362 = fVar361 * 0.0 + fVar331;
  fVar364 = fVar363 * 0.0 + fVar332;
  fVar367 = fVar366 * 0.0 + fVar333;
  auVar118._0_4_ = fVar359 + fVar338 * 3.0;
  auVar118._4_4_ = fVar362 + fVar344 * 3.0;
  auVar118._8_4_ = fVar364 + fVar345 * 3.0;
  auVar118._12_4_ = fVar367 + fVar346 * 3.0;
  auVar159._0_4_ = local_5d8 * 3.0;
  auVar159._4_4_ = fStack_5d4 * 3.0;
  auVar159._8_4_ = fStack_5d0 * 3.0;
  auVar159._12_4_ = fStack_5cc * 3.0;
  auVar130 = vsubps_avx(auVar118,auVar159);
  lVar11 = *(long *)(lVar9 + 0x38 + lVar71);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar71);
  lVar13 = *(long *)(_Var12 + 0x38 + lVar71);
  lVar71 = *(long *)(_Var12 + 0x48 + lVar71);
  pfVar1 = (float *)(lVar11 + lVar9 * uVar65);
  fVar151 = *pfVar1;
  fVar183 = pfVar1[1];
  fVar184 = pfVar1[2];
  fVar185 = pfVar1[3];
  pfVar1 = (float *)(lVar13 + uVar65 * lVar71);
  fVar305 = fVar151 + *pfVar1 * 0.33333334;
  fVar312 = fVar183 + pfVar1[1] * 0.33333334;
  fVar313 = fVar184 + pfVar1[2] * 0.33333334;
  fVar314 = fVar185 + pfVar1[3] * 0.33333334;
  auVar83 = *(undefined1 (*) [16])(lVar11 + lVar9 * lVar66);
  pfVar1 = (float *)(lVar13 + lVar71 * lVar66);
  auVar160._0_4_ = *pfVar1 * 0.33333334;
  auVar160._4_4_ = pfVar1[1] * 0.33333334;
  auVar160._8_4_ = pfVar1[2] * 0.33333334;
  auVar160._12_4_ = pfVar1[3] * 0.33333334;
  auVar178 = vsubps_avx(auVar83,auVar160);
  fVar186 = auVar83._0_4_;
  fVar204 = auVar83._4_4_;
  fVar205 = auVar83._8_4_;
  fVar206 = auVar83._12_4_;
  fVar230 = auVar178._0_4_ * 0.0;
  fVar232 = auVar178._4_4_ * 0.0;
  fVar250 = auVar178._8_4_ * 0.0;
  fVar150 = auVar178._12_4_ * 0.0;
  fVar315 = fVar186 * 0.0 + fVar230;
  fVar323 = fVar204 * 0.0 + fVar232;
  fVar324 = fVar205 * 0.0 + fVar250;
  fVar325 = fVar206 * 0.0 + fVar150;
  auVar256._0_4_ = fVar305 * 3.0 + fVar315;
  auVar256._4_4_ = fVar312 * 3.0 + fVar323;
  auVar256._8_4_ = fVar313 * 3.0 + fVar324;
  auVar256._12_4_ = fVar314 * 3.0 + fVar325;
  auVar281._0_4_ = fVar151 * 3.0;
  auVar281._4_4_ = fVar183 * 3.0;
  auVar281._8_4_ = fVar184 * 3.0;
  auVar281._12_4_ = fVar185 * 3.0;
  auVar14 = vsubps_avx(auVar256,auVar281);
  auVar282._0_4_ = fVar358 * 3.0;
  auVar282._4_4_ = fVar361 * 3.0;
  auVar282._8_4_ = fVar363 * 3.0;
  auVar282._12_4_ = fVar366 * 3.0;
  auVar328._0_4_ = auVar84._0_4_ * 3.0;
  auVar328._4_4_ = auVar84._4_4_ * 3.0;
  auVar328._8_4_ = auVar84._8_4_ * 3.0;
  auVar328._12_4_ = auVar84._12_4_ * 3.0;
  auVar83 = vsubps_avx(auVar282,auVar328);
  fVar338 = fVar338 * 0.0;
  fVar344 = fVar344 * 0.0;
  fVar345 = fVar345 * 0.0;
  fVar346 = fVar346 * 0.0;
  auVar283._0_4_ = fVar338 + auVar83._0_4_;
  auVar283._4_4_ = fVar344 + auVar83._4_4_;
  auVar283._8_4_ = fVar345 + auVar83._8_4_;
  auVar283._12_4_ = fVar346 + auVar83._12_4_;
  auVar329._0_4_ = local_5d8 + fVar338 + fVar359;
  auVar329._4_4_ = fStack_5d4 + fVar344 + fVar362;
  auVar329._8_4_ = fStack_5d0 + fVar345 + fVar364;
  auVar329._12_4_ = fStack_5cc + fVar346 + fVar367;
  auVar291._0_4_ = local_5d8 * 0.0;
  auVar291._4_4_ = fStack_5d4 * 0.0;
  auVar291._8_4_ = fStack_5d0 * 0.0;
  auVar291._12_4_ = fStack_5cc * 0.0;
  local_5c8._0_4_ = auVar291._0_4_ + fVar338 + fVar358 + fVar326;
  local_5c8._4_4_ = auVar291._4_4_ + fVar344 + fVar361 + fVar331;
  fStack_5c0 = auVar291._8_4_ + fVar345 + fVar363 + fVar332;
  fStack_5bc = auVar291._12_4_ + fVar346 + fVar366 + fVar333;
  auVar264 = vsubps_avx(auVar283,auVar291);
  auVar87._0_4_ = fVar186 * 3.0;
  auVar87._4_4_ = fVar204 * 3.0;
  auVar87._8_4_ = fVar205 * 3.0;
  auVar87._12_4_ = fVar206 * 3.0;
  auVar194._0_4_ = auVar178._0_4_ * 3.0;
  auVar194._4_4_ = auVar178._4_4_ * 3.0;
  auVar194._8_4_ = auVar178._8_4_ * 3.0;
  auVar194._12_4_ = auVar178._12_4_ * 3.0;
  auVar83 = vsubps_avx(auVar87,auVar194);
  fVar305 = fVar305 * 0.0;
  fVar312 = fVar312 * 0.0;
  fVar313 = fVar313 * 0.0;
  fVar314 = fVar314 * 0.0;
  auVar88._0_4_ = fVar305 + auVar83._0_4_;
  auVar88._4_4_ = fVar312 + auVar83._4_4_;
  auVar88._8_4_ = fVar313 + auVar83._8_4_;
  auVar88._12_4_ = fVar314 + auVar83._12_4_;
  auVar161._0_4_ = fVar151 + fVar305 + fVar315;
  auVar161._4_4_ = fVar183 + fVar312 + fVar323;
  auVar161._8_4_ = fVar184 + fVar313 + fVar324;
  auVar161._12_4_ = fVar185 + fVar314 + fVar325;
  auVar195._0_4_ = fVar151 * 0.0;
  auVar195._4_4_ = fVar183 * 0.0;
  auVar195._8_4_ = fVar184 * 0.0;
  auVar195._12_4_ = fVar185 * 0.0;
  auVar119._0_4_ = auVar195._0_4_ + fVar305 + fVar186 + fVar230;
  auVar119._4_4_ = auVar195._4_4_ + fVar312 + fVar204 + fVar232;
  auVar119._8_4_ = auVar195._8_4_ + fVar313 + fVar205 + fVar250;
  auVar119._12_4_ = auVar195._12_4_ + fVar314 + fVar206 + fVar150;
  auVar84 = vsubps_avx(auVar88,auVar195);
  auVar83 = vshufps_avx(auVar161,auVar161,0xc9);
  fVar324 = auVar130._0_4_;
  auVar196._0_4_ = fVar324 * auVar83._0_4_;
  fVar305 = auVar130._4_4_;
  auVar196._4_4_ = fVar305 * auVar83._4_4_;
  fVar312 = auVar130._8_4_;
  auVar196._8_4_ = fVar312 * auVar83._8_4_;
  fVar314 = auVar130._12_4_;
  auVar196._12_4_ = fVar314 * auVar83._12_4_;
  auVar83 = vshufps_avx(auVar130,auVar130,0xc9);
  auVar162._0_4_ = auVar83._0_4_ * auVar161._0_4_;
  auVar162._4_4_ = auVar83._4_4_ * auVar161._4_4_;
  auVar162._8_4_ = auVar83._8_4_ * auVar161._8_4_;
  auVar162._12_4_ = auVar83._12_4_ * auVar161._12_4_;
  auVar178 = vsubps_avx(auVar162,auVar196);
  auVar197._0_4_ = auVar83._0_4_ * auVar14._0_4_;
  auVar197._4_4_ = auVar83._4_4_ * auVar14._4_4_;
  auVar197._8_4_ = auVar83._8_4_ * auVar14._8_4_;
  auVar197._12_4_ = auVar83._12_4_ * auVar14._12_4_;
  auVar83 = vshufps_avx(auVar14,auVar14,0xc9);
  auVar213._0_4_ = fVar324 * auVar83._0_4_;
  auVar213._4_4_ = fVar305 * auVar83._4_4_;
  auVar213._8_4_ = fVar312 * auVar83._8_4_;
  auVar213._12_4_ = fVar314 * auVar83._12_4_;
  auVar14 = vsubps_avx(auVar197,auVar213);
  auVar83 = vshufps_avx(auVar119,auVar119,0xc9);
  fVar230 = auVar264._0_4_;
  auVar214._0_4_ = fVar230 * auVar83._0_4_;
  fVar250 = auVar264._4_4_;
  auVar214._4_4_ = fVar250 * auVar83._4_4_;
  fVar315 = auVar264._8_4_;
  auVar214._8_4_ = fVar315 * auVar83._8_4_;
  fVar323 = auVar264._12_4_;
  auVar214._12_4_ = fVar323 * auVar83._12_4_;
  auVar83 = vshufps_avx(auVar264,auVar264,0xc9);
  auVar120._0_4_ = auVar83._0_4_ * auVar119._0_4_;
  auVar120._4_4_ = auVar83._4_4_ * auVar119._4_4_;
  auVar120._8_4_ = auVar83._8_4_ * auVar119._8_4_;
  auVar120._12_4_ = auVar83._12_4_ * auVar119._12_4_;
  auVar15 = vsubps_avx(auVar120,auVar214);
  auVar178 = vshufps_avx(auVar178,auVar178,0xc9);
  auVar121._0_4_ = auVar83._0_4_ * auVar84._0_4_;
  auVar121._4_4_ = auVar83._4_4_ * auVar84._4_4_;
  auVar121._8_4_ = auVar83._8_4_ * auVar84._8_4_;
  auVar121._12_4_ = auVar83._12_4_ * auVar84._12_4_;
  auVar83 = vshufps_avx(auVar84,auVar84,0xc9);
  auVar89._0_4_ = fVar230 * auVar83._0_4_;
  auVar89._4_4_ = fVar250 * auVar83._4_4_;
  auVar89._8_4_ = fVar315 * auVar83._8_4_;
  auVar89._12_4_ = fVar323 * auVar83._12_4_;
  auVar83 = vdpps_avx(auVar178,auVar178,0x7f);
  auVar73 = vsubps_avx(auVar121,auVar89);
  fVar151 = auVar83._0_4_;
  auVar122 = ZEXT416((uint)fVar151);
  auVar84 = vrsqrtss_avx(auVar122,auVar122);
  fVar183 = auVar84._0_4_;
  auVar84 = vshufps_avx(auVar14,auVar14,0xc9);
  auVar83 = vshufps_avx(auVar83,auVar83,0);
  auVar238._0_4_ = auVar83._0_4_ * auVar84._0_4_;
  auVar238._4_4_ = auVar83._4_4_ * auVar84._4_4_;
  auVar238._8_4_ = auVar83._8_4_ * auVar84._8_4_;
  auVar238._12_4_ = auVar83._12_4_ * auVar84._12_4_;
  auVar83 = vdpps_avx(auVar178,auVar84,0x7f);
  auVar83 = vshufps_avx(auVar83,auVar83,0);
  auVar198._0_4_ = auVar178._0_4_ * auVar83._0_4_;
  auVar198._4_4_ = auVar178._4_4_ * auVar83._4_4_;
  auVar198._8_4_ = auVar178._8_4_ * auVar83._8_4_;
  auVar198._12_4_ = auVar178._12_4_ * auVar83._12_4_;
  auVar74 = vsubps_avx(auVar238,auVar198);
  auVar83 = vrcpss_avx(auVar122,auVar122);
  auVar83 = ZEXT416((uint)(auVar83._0_4_ * (2.0 - fVar151 * auVar83._0_4_)));
  auVar14 = vshufps_avx(auVar83,auVar83,0);
  auVar15 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar83 = ZEXT416((uint)(fVar183 * 1.5 - fVar151 * 0.5 * fVar183 * fVar183 * fVar183));
  auVar122 = vshufps_avx(auVar83,auVar83,0);
  fVar186 = auVar178._0_4_ * auVar122._0_4_;
  fVar204 = auVar178._4_4_ * auVar122._4_4_;
  fVar205 = auVar178._8_4_ * auVar122._8_4_;
  fVar206 = auVar178._12_4_ * auVar122._12_4_;
  auVar83 = vdpps_avx(auVar15,auVar15,0x7f);
  fVar151 = auVar83._0_4_;
  auVar178 = ZEXT416((uint)fVar151);
  auVar84 = vrsqrtss_avx(auVar178,auVar178);
  fVar183 = auVar84._0_4_;
  auVar84 = vshufps_avx(auVar73,auVar73,0xc9);
  auVar83 = vshufps_avx(auVar83,auVar83,0);
  auVar257._0_4_ = auVar83._0_4_ * auVar84._0_4_;
  auVar257._4_4_ = auVar83._4_4_ * auVar84._4_4_;
  auVar257._8_4_ = auVar83._8_4_ * auVar84._8_4_;
  auVar257._12_4_ = auVar83._12_4_ * auVar84._12_4_;
  auVar83 = vdpps_avx(auVar15,auVar84,0x7f);
  auVar83 = vshufps_avx(auVar83,auVar83,0);
  auVar90._0_4_ = auVar83._0_4_ * auVar15._0_4_;
  auVar90._4_4_ = auVar83._4_4_ * auVar15._4_4_;
  auVar90._8_4_ = auVar83._8_4_ * auVar15._8_4_;
  auVar90._12_4_ = auVar83._12_4_ * auVar15._12_4_;
  auVar73 = vsubps_avx(auVar257,auVar90);
  auVar83 = vrcpss_avx(auVar178,auVar178);
  auVar83 = ZEXT416((uint)(auVar83._0_4_ * (2.0 - fVar151 * auVar83._0_4_)));
  auVar83 = vshufps_avx(auVar83,auVar83,0);
  auVar84 = ZEXT416((uint)(fVar183 * 1.5 - fVar183 * fVar183 * fVar151 * 0.5 * fVar183));
  auVar84 = vshufps_avx(auVar84,auVar84,0);
  fVar151 = auVar15._0_4_ * auVar84._0_4_;
  fVar183 = auVar15._4_4_ * auVar84._4_4_;
  fVar184 = auVar15._8_4_ * auVar84._8_4_;
  fVar185 = auVar15._12_4_ * auVar84._12_4_;
  auVar178 = vshufps_avx(auVar130,auVar130,0xff);
  auVar15 = vshufps_avx(auVar329,auVar329,0xff);
  auVar239._0_4_ = fVar186 * auVar15._0_4_;
  auVar239._4_4_ = fVar204 * auVar15._4_4_;
  auVar239._8_4_ = fVar205 * auVar15._8_4_;
  auVar239._12_4_ = fVar206 * auVar15._12_4_;
  auVar123._0_4_ =
       fVar186 * auVar178._0_4_ + auVar15._0_4_ * auVar122._0_4_ * auVar14._0_4_ * auVar74._0_4_;
  auVar123._4_4_ =
       fVar204 * auVar178._4_4_ + auVar15._4_4_ * auVar122._4_4_ * auVar14._4_4_ * auVar74._4_4_;
  auVar123._8_4_ =
       fVar205 * auVar178._8_4_ + auVar15._8_4_ * auVar122._8_4_ * auVar14._8_4_ * auVar74._8_4_;
  auVar123._12_4_ =
       fVar206 * auVar178._12_4_ +
       auVar15._12_4_ * auVar122._12_4_ * auVar14._12_4_ * auVar74._12_4_;
  auVar15 = vsubps_avx(auVar329,auVar239);
  auVar122 = vsubps_avx(auVar130,auVar123);
  auVar178 = vshufps_avx(auVar264,auVar264,0xff);
  auVar14 = vshufps_avx(_local_5c8,_local_5c8,0xff);
  auVar163._0_4_ = auVar14._0_4_ * fVar151;
  auVar163._4_4_ = auVar14._4_4_ * fVar183;
  auVar163._8_4_ = auVar14._8_4_ * fVar184;
  auVar163._12_4_ = auVar14._12_4_ * fVar185;
  auVar124._0_4_ =
       auVar178._0_4_ * fVar151 + auVar14._0_4_ * auVar84._0_4_ * auVar73._0_4_ * auVar83._0_4_;
  auVar124._4_4_ =
       auVar178._4_4_ * fVar183 + auVar14._4_4_ * auVar84._4_4_ * auVar73._4_4_ * auVar83._4_4_;
  auVar124._8_4_ =
       auVar178._8_4_ * fVar184 + auVar14._8_4_ * auVar84._8_4_ * auVar73._8_4_ * auVar83._8_4_;
  auVar124._12_4_ =
       auVar178._12_4_ * fVar185 + auVar14._12_4_ * auVar84._12_4_ * auVar73._12_4_ * auVar83._12_4_
  ;
  auVar178 = vsubps_avx(_local_5c8,auVar163);
  auVar340._0_4_ = (float)local_5c8._0_4_ + auVar163._0_4_;
  auVar340._4_4_ = (float)local_5c8._4_4_ + auVar163._4_4_;
  auVar340._8_4_ = fStack_5c0 + auVar163._8_4_;
  auVar340._12_4_ = fStack_5bc + auVar163._12_4_;
  auVar14 = vsubps_avx(auVar264,auVar124);
  local_5f8 = auVar140._0_4_;
  fStack_5f4 = auVar140._4_4_;
  fStack_5f0 = auVar140._8_4_;
  fStack_5ec = auVar140._12_4_;
  local_4f8 = auVar16._0_4_;
  fStack_4f4 = auVar16._4_4_;
  fStack_4f0 = auVar16._8_4_;
  fStack_4ec = auVar16._12_4_;
  auVar83 = vshufps_avx(ZEXT416((uint)fVar207),ZEXT416((uint)fVar207),0);
  auVar84 = vshufps_avx(ZEXT416((uint)(1.0 - fVar207)),ZEXT416((uint)(1.0 - fVar207)),0);
  fVar151 = auVar83._0_4_;
  fVar183 = auVar83._4_4_;
  fVar184 = auVar83._8_4_;
  fVar185 = auVar83._12_4_;
  fVar186 = auVar84._0_4_;
  fVar204 = auVar84._4_4_;
  fVar205 = auVar84._8_4_;
  fVar206 = auVar84._12_4_;
  local_3e8._0_4_ = fVar186 * local_4f8 + fVar151 * auVar15._0_4_;
  local_3e8._4_4_ = fVar204 * fStack_4f4 + fVar183 * auVar15._4_4_;
  fStack_3e0 = fVar205 * fStack_4f0 + fVar184 * auVar15._8_4_;
  fStack_3dc = fVar206 * fStack_4ec + fVar185 * auVar15._12_4_;
  fVar232 = fVar186 * (local_4f8 + local_5f8 * 0.33333334) +
            fVar151 * (auVar15._0_4_ + auVar122._0_4_ * 0.33333334);
  fVar150 = fVar204 * (fStack_4f4 + fStack_5f4 * 0.33333334) +
            fVar183 * (auVar15._4_4_ + auVar122._4_4_ * 0.33333334);
  fVar325 = fVar205 * (fStack_4f0 + fStack_5f0 * 0.33333334) +
            fVar184 * (auVar15._8_4_ + auVar122._8_4_ * 0.33333334);
  fVar313 = fVar206 * (fStack_4ec + fStack_5ec * 0.33333334) +
            fVar185 * (auVar15._12_4_ + auVar122._12_4_ * 0.33333334);
  local_468 = auVar168._0_4_;
  fStack_464 = auVar168._4_4_;
  fStack_460 = auVar168._8_4_;
  fStack_45c = auVar168._12_4_;
  auVar199._0_4_ = local_468 * 0.33333334;
  auVar199._4_4_ = fStack_464 * 0.33333334;
  auVar199._8_4_ = fStack_460 * 0.33333334;
  auVar199._12_4_ = fStack_45c * 0.33333334;
  auVar83 = vsubps_avx(auVar129,auVar199);
  auVar258._0_4_ = (fVar348 + auVar85._0_4_) * 0.33333334;
  auVar258._4_4_ = (fVar355 + auVar85._4_4_) * 0.33333334;
  auVar258._8_4_ = (fVar356 + auVar85._8_4_) * 0.33333334;
  auVar258._12_4_ = (fVar357 + auVar85._12_4_) * 0.33333334;
  auVar84 = vsubps_avx(_local_568,auVar258);
  auVar240._0_4_ = auVar14._0_4_ * 0.33333334;
  auVar240._4_4_ = auVar14._4_4_ * 0.33333334;
  auVar240._8_4_ = auVar14._8_4_ * 0.33333334;
  auVar240._12_4_ = auVar14._12_4_ * 0.33333334;
  auVar14 = vsubps_avx(auVar178,auVar240);
  auVar125._0_4_ = (fVar230 + auVar124._0_4_) * 0.33333334;
  auVar125._4_4_ = (fVar250 + auVar124._4_4_) * 0.33333334;
  auVar125._8_4_ = (fVar315 + auVar124._8_4_) * 0.33333334;
  auVar125._12_4_ = (fVar323 + auVar124._12_4_) * 0.33333334;
  auVar15 = vsubps_avx(auVar340,auVar125);
  local_3f8._0_4_ = fVar186 * auVar83._0_4_ + fVar151 * auVar14._0_4_;
  local_3f8._4_4_ = fVar204 * auVar83._4_4_ + fVar183 * auVar14._4_4_;
  fStack_3f0 = fVar205 * auVar83._8_4_ + fVar184 * auVar14._8_4_;
  fStack_3ec = fVar206 * auVar83._12_4_ + fVar185 * auVar14._12_4_;
  local_408._0_4_ = auVar178._0_4_ * fVar151 + fVar186 * auVar129._0_4_;
  local_408._4_4_ = auVar178._4_4_ * fVar183 + fVar204 * auVar129._4_4_;
  fStack_400 = auVar178._8_4_ * fVar184 + fVar205 * auVar129._8_4_;
  fStack_3fc = auVar178._12_4_ * fVar185 + fVar206 * auVar129._12_4_;
  local_418._0_4_ =
       fVar186 * (auVar317._0_4_ + auVar271._0_4_) + fVar151 * (auVar329._0_4_ + auVar239._0_4_);
  local_418._4_4_ =
       fVar204 * (auVar317._4_4_ + auVar271._4_4_) + fVar183 * (auVar329._4_4_ + auVar239._4_4_);
  fStack_410 = fVar205 * (auVar317._8_4_ + auVar271._8_4_) +
               fVar184 * (auVar329._8_4_ + auVar239._8_4_);
  fStack_40c = fVar206 * (auVar317._12_4_ + auVar271._12_4_) +
               fVar185 * (auVar329._12_4_ + auVar239._12_4_);
  fVar250 = fVar186 * (auVar317._0_4_ + auVar271._0_4_ + (fVar229 + auVar193._0_4_) * 0.33333334) +
            ((fVar324 + auVar123._0_4_) * 0.33333334 + auVar329._0_4_ + auVar239._0_4_) * fVar151;
  fVar315 = fVar204 * (auVar317._4_4_ + auVar271._4_4_ + (fVar231 + auVar193._4_4_) * 0.33333334) +
            ((fVar305 + auVar123._4_4_) * 0.33333334 + auVar329._4_4_ + auVar239._4_4_) * fVar183;
  fVar305 = fVar205 * (auVar317._8_4_ + auVar271._8_4_ + (fVar251 + auVar193._8_4_) * 0.33333334) +
            ((fVar312 + auVar123._8_4_) * 0.33333334 + auVar329._8_4_ + auVar239._8_4_) * fVar184;
  fVar314 = fVar206 * (auVar317._12_4_ + auVar271._12_4_ + (fVar252 + auVar193._12_4_) * 0.33333334)
            + ((fVar314 + auVar123._12_4_) * 0.33333334 + auVar329._12_4_ + auVar239._12_4_) *
              fVar185;
  fVar251 = fVar186 * auVar84._0_4_ + fVar151 * auVar15._0_4_;
  fVar323 = fVar204 * auVar84._4_4_ + fVar183 * auVar15._4_4_;
  fVar312 = fVar205 * auVar84._8_4_ + fVar184 * auVar15._8_4_;
  fVar326 = fVar206 * auVar84._12_4_ + fVar185 * auVar15._12_4_;
  local_428 = fVar186 * (auVar307._0_4_ + auVar237._0_4_) + auVar340._0_4_ * fVar151;
  fStack_424 = fVar204 * (auVar307._4_4_ + auVar237._4_4_) + auVar340._4_4_ * fVar183;
  fStack_420 = fVar205 * (auVar307._8_4_ + auVar237._8_4_) + auVar340._8_4_ * fVar184;
  fStack_41c = fVar206 * (auVar307._12_4_ + auVar237._12_4_) + auVar340._12_4_ * fVar185;
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_268 = vsubps_avx(_local_3e8,auVar83);
  auVar178 = vmovsldup_avx(local_268);
  auVar84 = vmovshdup_avx(local_268);
  auVar14 = vshufps_avx(local_268,local_268,0xaa);
  fVar151 = pre->ray_space[k].vx.field_0.m128[0];
  fVar183 = pre->ray_space[k].vx.field_0.m128[1];
  fVar184 = pre->ray_space[k].vx.field_0.m128[2];
  fVar185 = pre->ray_space[k].vx.field_0.m128[3];
  fVar186 = pre->ray_space[k].vy.field_0.m128[0];
  fVar204 = pre->ray_space[k].vy.field_0.m128[1];
  fVar205 = pre->ray_space[k].vy.field_0.m128[2];
  fVar206 = pre->ray_space[k].vy.field_0.m128[3];
  fVar207 = pre->ray_space[k].vz.field_0.m128[0];
  fVar229 = pre->ray_space[k].vz.field_0.m128[1];
  fVar230 = pre->ray_space[k].vz.field_0.m128[2];
  fVar231 = pre->ray_space[k].vz.field_0.m128[3];
  fVar252 = fVar151 * auVar178._0_4_ + fVar186 * auVar84._0_4_ + fVar207 * auVar14._0_4_;
  fVar324 = fVar183 * auVar178._4_4_ + fVar204 * auVar84._4_4_ + fVar229 * auVar14._4_4_;
  local_528._4_4_ = fVar324;
  local_528._0_4_ = fVar252;
  fStack_520 = fVar184 * auVar178._8_4_ + fVar205 * auVar84._8_4_ + fVar230 * auVar14._8_4_;
  fStack_51c = fVar185 * auVar178._12_4_ + fVar206 * auVar84._12_4_ + fVar231 * auVar14._12_4_;
  auVar60._4_4_ = fVar150;
  auVar60._0_4_ = fVar232;
  auVar60._8_4_ = fVar325;
  auVar60._12_4_ = fVar313;
  local_278 = vsubps_avx(auVar60,auVar83);
  auVar14 = vshufps_avx(local_278,local_278,0xaa);
  auVar84 = vmovshdup_avx(local_278);
  auVar178 = vmovsldup_avx(local_278);
  auVar349._0_4_ = fVar151 * auVar178._0_4_ + fVar186 * auVar84._0_4_ + fVar207 * auVar14._0_4_;
  auVar349._4_4_ = fVar183 * auVar178._4_4_ + fVar204 * auVar84._4_4_ + fVar229 * auVar14._4_4_;
  auVar349._8_4_ = fVar184 * auVar178._8_4_ + fVar205 * auVar84._8_4_ + fVar230 * auVar14._8_4_;
  auVar349._12_4_ = fVar185 * auVar178._12_4_ + fVar206 * auVar84._12_4_ + fVar231 * auVar14._12_4_;
  local_288 = vsubps_avx(_local_3f8,auVar83);
  auVar14 = vshufps_avx(local_288,local_288,0xaa);
  auVar84 = vmovshdup_avx(local_288);
  auVar178 = vmovsldup_avx(local_288);
  auVar341._0_4_ = fVar151 * auVar178._0_4_ + fVar186 * auVar84._0_4_ + fVar207 * auVar14._0_4_;
  auVar341._4_4_ = fVar183 * auVar178._4_4_ + fVar204 * auVar84._4_4_ + fVar229 * auVar14._4_4_;
  auVar341._8_4_ = fVar184 * auVar178._8_4_ + fVar205 * auVar84._8_4_ + fVar230 * auVar14._8_4_;
  auVar341._12_4_ = fVar185 * auVar178._12_4_ + fVar206 * auVar84._12_4_ + fVar231 * auVar14._12_4_;
  local_298 = vsubps_avx(_local_408,auVar83);
  auVar14 = vshufps_avx(local_298,local_298,0xaa);
  auVar84 = vmovshdup_avx(local_298);
  auVar178 = vmovsldup_avx(local_298);
  auVar126._0_4_ = auVar178._0_4_ * fVar151 + auVar84._0_4_ * fVar186 + fVar207 * auVar14._0_4_;
  auVar126._4_4_ = auVar178._4_4_ * fVar183 + auVar84._4_4_ * fVar204 + fVar229 * auVar14._4_4_;
  auVar126._8_4_ = auVar178._8_4_ * fVar184 + auVar84._8_4_ * fVar205 + fVar230 * auVar14._8_4_;
  auVar126._12_4_ = auVar178._12_4_ * fVar185 + auVar84._12_4_ * fVar206 + fVar231 * auVar14._12_4_;
  local_2a8 = vsubps_avx(_local_418,auVar83);
  auVar14 = vshufps_avx(local_2a8,local_2a8,0xaa);
  auVar84 = vmovshdup_avx(local_2a8);
  auVar178 = vmovsldup_avx(local_2a8);
  auVar284._0_4_ = auVar178._0_4_ * fVar151 + auVar84._0_4_ * fVar186 + auVar14._0_4_ * fVar207;
  auVar284._4_4_ = auVar178._4_4_ * fVar183 + auVar84._4_4_ * fVar204 + auVar14._4_4_ * fVar229;
  auVar284._8_4_ = auVar178._8_4_ * fVar184 + auVar84._8_4_ * fVar205 + auVar14._8_4_ * fVar230;
  auVar284._12_4_ = auVar178._12_4_ * fVar185 + auVar84._12_4_ * fVar206 + auVar14._12_4_ * fVar231;
  auVar58._4_4_ = fVar315;
  auVar58._0_4_ = fVar250;
  auVar58._8_4_ = fVar305;
  auVar58._12_4_ = fVar314;
  local_2b8 = vsubps_avx(auVar58,auVar83);
  auVar14 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar84 = vmovshdup_avx(local_2b8);
  auVar178 = vmovsldup_avx(local_2b8);
  auVar292._0_4_ = auVar178._0_4_ * fVar151 + auVar84._0_4_ * fVar186 + auVar14._0_4_ * fVar207;
  auVar292._4_4_ = auVar178._4_4_ * fVar183 + auVar84._4_4_ * fVar204 + auVar14._4_4_ * fVar229;
  auVar292._8_4_ = auVar178._8_4_ * fVar184 + auVar84._8_4_ * fVar205 + auVar14._8_4_ * fVar230;
  auVar292._12_4_ = auVar178._12_4_ * fVar185 + auVar84._12_4_ * fVar206 + auVar14._12_4_ * fVar231;
  auVar56._4_4_ = fVar323;
  auVar56._0_4_ = fVar251;
  auVar56._8_4_ = fVar312;
  auVar56._12_4_ = fVar326;
  local_2c8 = vsubps_avx(auVar56,auVar83);
  auVar14 = vshufps_avx(local_2c8,local_2c8,0xaa);
  auVar84 = vmovshdup_avx(local_2c8);
  auVar178 = vmovsldup_avx(local_2c8);
  auVar308._0_4_ = auVar178._0_4_ * fVar151 + auVar84._0_4_ * fVar186 + auVar14._0_4_ * fVar207;
  auVar308._4_4_ = auVar178._4_4_ * fVar183 + auVar84._4_4_ * fVar204 + auVar14._4_4_ * fVar229;
  auVar308._8_4_ = auVar178._8_4_ * fVar184 + auVar84._8_4_ * fVar205 + auVar14._8_4_ * fVar230;
  auVar308._12_4_ = auVar178._12_4_ * fVar185 + auVar84._12_4_ * fVar206 + auVar14._12_4_ * fVar231;
  auVar62._4_4_ = fStack_424;
  auVar62._0_4_ = local_428;
  auVar62._8_4_ = fStack_420;
  auVar62._12_4_ = fStack_41c;
  local_2d8 = vsubps_avx(auVar62,auVar83);
  auVar178 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar83 = vmovshdup_avx(local_2d8);
  auVar84 = vmovsldup_avx(local_2d8);
  auVar91._0_4_ = fVar151 * auVar84._0_4_ + fVar186 * auVar83._0_4_ + fVar207 * auVar178._0_4_;
  auVar91._4_4_ = fVar183 * auVar84._4_4_ + fVar204 * auVar83._4_4_ + fVar229 * auVar178._4_4_;
  auVar91._8_4_ = fVar184 * auVar84._8_4_ + fVar205 * auVar83._8_4_ + fVar230 * auVar178._8_4_;
  auVar91._12_4_ = fVar185 * auVar84._12_4_ + fVar206 * auVar83._12_4_ + fVar231 * auVar178._12_4_;
  auVar14 = vmovlhps_avx(_local_528,auVar284);
  auVar15 = vmovlhps_avx(auVar349,auVar292);
  auVar122 = vmovlhps_avx(auVar341,auVar308);
  _local_3c8 = vmovlhps_avx(auVar126,auVar91);
  auVar83 = vminps_avx(auVar14,auVar15);
  auVar84 = vminps_avx(auVar122,_local_3c8);
  auVar178 = vminps_avx(auVar83,auVar84);
  auVar83 = vmaxps_avx(auVar14,auVar15);
  auVar84 = vmaxps_avx(auVar122,_local_3c8);
  auVar83 = vmaxps_avx(auVar83,auVar84);
  auVar84 = vshufpd_avx(auVar178,auVar178,3);
  auVar178 = vminps_avx(auVar178,auVar84);
  auVar84 = vshufpd_avx(auVar83,auVar83,3);
  auVar84 = vmaxps_avx(auVar83,auVar84);
  auVar259._8_4_ = 0x7fffffff;
  auVar259._0_8_ = 0x7fffffff7fffffff;
  auVar259._12_4_ = 0x7fffffff;
  auVar83 = vandps_avx(auVar178,auVar259);
  auVar84 = vandps_avx(auVar84,auVar259);
  auVar83 = vmaxps_avx(auVar83,auVar84);
  auVar84 = vmovshdup_avx(auVar83);
  auVar83 = vmaxss_avx(auVar84,auVar83);
  fVar151 = auVar83._0_4_ * 9.536743e-07;
  local_3d8 = ZEXT416((uint)fVar151);
  auVar83 = vshufps_avx(local_3d8,ZEXT416((uint)fVar151),0);
  local_78._16_16_ = auVar83;
  local_78._0_16_ = auVar83;
  auVar92._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
  auVar92._8_4_ = auVar83._8_4_ ^ 0x80000000;
  auVar92._12_4_ = auVar83._12_4_ ^ 0x80000000;
  local_228._16_16_ = auVar92;
  local_228._0_16_ = auVar92;
  local_308 = vpshufd_avx(ZEXT416(uVar64),0);
  local_318 = vshufps_avx(ZEXT416(uVar69),ZEXT416(uVar69),0);
  uVar65 = 0;
  uVar69 = 0;
  fVar151 = *(float *)(ray + k * 4 + 0x30);
  _local_238 = vsubps_avx(auVar15,auVar14);
  _local_248 = vsubps_avx(auVar122,auVar15);
  _local_258 = vsubps_avx(_local_3c8,auVar122);
  _local_328 = vsubps_avx(_local_418,_local_3e8);
  auVar59._4_4_ = fVar315;
  auVar59._0_4_ = fVar250;
  auVar59._8_4_ = fVar305;
  auVar59._12_4_ = fVar314;
  auVar61._4_4_ = fVar150;
  auVar61._0_4_ = fVar232;
  auVar61._8_4_ = fVar325;
  auVar61._12_4_ = fVar313;
  _local_338 = vsubps_avx(auVar59,auVar61);
  auVar57._4_4_ = fVar323;
  auVar57._0_4_ = fVar251;
  auVar57._8_4_ = fVar312;
  auVar57._12_4_ = fVar326;
  _local_348 = vsubps_avx(auVar57,_local_3f8);
  _local_358 = vsubps_avx(auVar62,_local_408);
  auVar93 = ZEXT816(0x3f80000000000000);
  local_2e8 = auVar93;
LAB_00f88989:
  do {
    auVar83 = vshufps_avx(auVar93,auVar93,0x50);
    auVar350._8_4_ = 0x3f800000;
    auVar350._0_8_ = 0x3f8000003f800000;
    auVar350._12_4_ = 0x3f800000;
    auVar354._16_4_ = 0x3f800000;
    auVar354._0_16_ = auVar350;
    auVar354._20_4_ = 0x3f800000;
    auVar354._24_4_ = 0x3f800000;
    auVar354._28_4_ = 0x3f800000;
    auVar84 = vsubps_avx(auVar350,auVar83);
    fVar183 = auVar83._0_4_;
    fVar184 = auVar83._4_4_;
    fVar185 = auVar83._8_4_;
    fVar186 = auVar83._12_4_;
    fVar204 = auVar84._0_4_;
    fVar205 = auVar84._4_4_;
    fVar206 = auVar84._8_4_;
    fVar207 = auVar84._12_4_;
    auVar200._0_4_ = auVar284._0_4_ * fVar183 + fVar204 * fVar252;
    auVar200._4_4_ = auVar284._4_4_ * fVar184 + fVar205 * fVar324;
    auVar200._8_4_ = auVar284._0_4_ * fVar185 + fVar206 * fVar252;
    auVar200._12_4_ = auVar284._4_4_ * fVar186 + fVar207 * fVar324;
    auVar164._0_4_ = auVar292._0_4_ * fVar183 + fVar204 * auVar349._0_4_;
    auVar164._4_4_ = auVar292._4_4_ * fVar184 + fVar205 * auVar349._4_4_;
    auVar164._8_4_ = auVar292._0_4_ * fVar185 + fVar206 * auVar349._0_4_;
    auVar164._12_4_ = auVar292._4_4_ * fVar186 + fVar207 * auVar349._4_4_;
    auVar272._0_4_ = auVar308._0_4_ * fVar183 + auVar341._0_4_ * fVar204;
    auVar272._4_4_ = auVar308._4_4_ * fVar184 + auVar341._4_4_ * fVar205;
    auVar272._8_4_ = auVar308._0_4_ * fVar185 + auVar341._0_4_ * fVar206;
    auVar272._12_4_ = auVar308._4_4_ * fVar186 + auVar341._4_4_ * fVar207;
    auVar215._0_4_ = auVar91._0_4_ * fVar183 + auVar126._0_4_ * fVar204;
    auVar215._4_4_ = auVar91._4_4_ * fVar184 + auVar126._4_4_ * fVar205;
    auVar215._8_4_ = auVar91._0_4_ * fVar185 + auVar126._0_4_ * fVar206;
    auVar215._12_4_ = auVar91._4_4_ * fVar186 + auVar126._4_4_ * fVar207;
    auVar83 = vmovshdup_avx(local_2e8);
    auVar84 = vshufps_avx(local_2e8,local_2e8,0);
    auVar298._16_16_ = auVar84;
    auVar298._0_16_ = auVar84;
    auVar178 = vshufps_avx(local_2e8,local_2e8,0x55);
    auVar109._16_16_ = auVar178;
    auVar109._0_16_ = auVar178;
    auVar108 = vsubps_avx(auVar109,auVar298);
    auVar178 = vshufps_avx(auVar200,auVar200,0);
    auVar140 = vshufps_avx(auVar200,auVar200,0x55);
    auVar129 = vshufps_avx(auVar164,auVar164,0);
    auVar168 = vshufps_avx(auVar164,auVar164,0x55);
    auVar130 = vshufps_avx(auVar272,auVar272,0);
    auVar264 = vshufps_avx(auVar272,auVar272,0x55);
    auVar16 = vshufps_avx(auVar215,auVar215,0);
    auVar73 = vshufps_avx(auVar215,auVar215,0x55);
    auVar83 = ZEXT416((uint)((auVar83._0_4_ - local_2e8._0_4_) * 0.04761905));
    auVar83 = vshufps_avx(auVar83,auVar83,0);
    auVar311._0_4_ = auVar84._0_4_ + auVar108._0_4_ * 0.0;
    auVar311._4_4_ = auVar84._4_4_ + auVar108._4_4_ * 0.14285715;
    auVar311._8_4_ = auVar84._8_4_ + auVar108._8_4_ * 0.2857143;
    auVar311._12_4_ = auVar84._12_4_ + auVar108._12_4_ * 0.42857146;
    auVar311._16_4_ = auVar84._0_4_ + auVar108._16_4_ * 0.5714286;
    auVar311._20_4_ = auVar84._4_4_ + auVar108._20_4_ * 0.71428573;
    auVar311._24_4_ = auVar84._8_4_ + auVar108._24_4_ * 0.8571429;
    auVar311._28_4_ = auVar84._12_4_ + auVar108._28_4_;
    auVar17 = vsubps_avx(auVar354,auVar311);
    fVar183 = auVar129._0_4_;
    fVar185 = auVar129._4_4_;
    fVar204 = auVar129._8_4_;
    fVar206 = auVar129._12_4_;
    fVar364 = auVar17._0_4_;
    fVar367 = auVar17._4_4_;
    fVar300 = auVar17._8_4_;
    fVar301 = auVar17._12_4_;
    fVar302 = auVar17._16_4_;
    fVar303 = auVar17._20_4_;
    fVar304 = auVar17._24_4_;
    fVar356 = auVar168._0_4_;
    fVar358 = auVar168._4_4_;
    fVar363 = auVar168._8_4_;
    fVar359 = auVar168._12_4_;
    fVar347 = auVar140._12_4_ + 1.0;
    fVar345 = auVar130._0_4_;
    fVar346 = auVar130._4_4_;
    fVar348 = auVar130._8_4_;
    fVar355 = auVar130._12_4_;
    fVar229 = fVar345 * auVar311._0_4_ + fVar364 * fVar183;
    fVar230 = fVar346 * auVar311._4_4_ + fVar367 * fVar185;
    fVar231 = fVar348 * auVar311._8_4_ + fVar300 * fVar204;
    fVar331 = fVar355 * auVar311._12_4_ + fVar301 * fVar206;
    fVar332 = fVar345 * auVar311._16_4_ + fVar302 * fVar183;
    fVar333 = fVar346 * auVar311._20_4_ + fVar303 * fVar185;
    fVar338 = fVar348 * auVar311._24_4_ + fVar304 * fVar204;
    fVar184 = auVar264._0_4_;
    fVar186 = auVar264._4_4_;
    fVar205 = auVar264._8_4_;
    fVar207 = auVar264._12_4_;
    fVar357 = fVar356 * fVar364 + auVar311._0_4_ * fVar184;
    fVar361 = fVar358 * fVar367 + auVar311._4_4_ * fVar186;
    fVar366 = fVar363 * fVar300 + auVar311._8_4_ * fVar205;
    fVar362 = fVar359 * fVar301 + auVar311._12_4_ * fVar207;
    fVar334 = fVar356 * fVar302 + auVar311._16_4_ * fVar184;
    fVar335 = fVar358 * fVar303 + auVar311._20_4_ * fVar186;
    fVar336 = fVar363 * fVar304 + auVar311._24_4_ * fVar205;
    fVar337 = fVar359 + fVar206;
    auVar84 = vshufps_avx(auVar200,auVar200,0xaa);
    auVar129 = vshufps_avx(auVar200,auVar200,0xff);
    fVar344 = fVar355 + 0.0;
    auVar168 = vshufps_avx(auVar164,auVar164,0xaa);
    auVar130 = vshufps_avx(auVar164,auVar164,0xff);
    auVar227._0_4_ =
         fVar364 * (auVar311._0_4_ * fVar183 + fVar364 * auVar178._0_4_) + auVar311._0_4_ * fVar229;
    auVar227._4_4_ =
         fVar367 * (auVar311._4_4_ * fVar185 + fVar367 * auVar178._4_4_) + auVar311._4_4_ * fVar230;
    auVar227._8_4_ =
         fVar300 * (auVar311._8_4_ * fVar204 + fVar300 * auVar178._8_4_) + auVar311._8_4_ * fVar231;
    auVar227._12_4_ =
         fVar301 * (auVar311._12_4_ * fVar206 + fVar301 * auVar178._12_4_) +
         auVar311._12_4_ * fVar331;
    auVar227._16_4_ =
         fVar302 * (auVar311._16_4_ * fVar183 + fVar302 * auVar178._0_4_) +
         auVar311._16_4_ * fVar332;
    auVar227._20_4_ =
         fVar303 * (auVar311._20_4_ * fVar185 + fVar303 * auVar178._4_4_) +
         auVar311._20_4_ * fVar333;
    auVar227._24_4_ =
         fVar304 * (auVar311._24_4_ * fVar204 + fVar304 * auVar178._8_4_) +
         auVar311._24_4_ * fVar338;
    auVar227._28_4_ = auVar178._12_4_ + 1.0 + fVar207;
    auVar248._0_4_ =
         fVar364 * (fVar356 * auVar311._0_4_ + auVar140._0_4_ * fVar364) + auVar311._0_4_ * fVar357;
    auVar248._4_4_ =
         fVar367 * (fVar358 * auVar311._4_4_ + auVar140._4_4_ * fVar367) + auVar311._4_4_ * fVar361;
    auVar248._8_4_ =
         fVar300 * (fVar363 * auVar311._8_4_ + auVar140._8_4_ * fVar300) + auVar311._8_4_ * fVar366;
    auVar248._12_4_ =
         fVar301 * (fVar359 * auVar311._12_4_ + auVar140._12_4_ * fVar301) +
         auVar311._12_4_ * fVar362;
    auVar248._16_4_ =
         fVar302 * (fVar356 * auVar311._16_4_ + auVar140._0_4_ * fVar302) +
         auVar311._16_4_ * fVar334;
    auVar248._20_4_ =
         fVar303 * (fVar358 * auVar311._20_4_ + auVar140._4_4_ * fVar303) +
         auVar311._20_4_ * fVar335;
    auVar248._24_4_ =
         fVar304 * (fVar363 * auVar311._24_4_ + auVar140._8_4_ * fVar304) +
         auVar311._24_4_ * fVar336;
    auVar248._28_4_ = auVar73._12_4_ + fVar207;
    auVar110._0_4_ =
         fVar364 * fVar229 + auVar311._0_4_ * (fVar345 * fVar364 + auVar16._0_4_ * auVar311._0_4_);
    auVar110._4_4_ =
         fVar367 * fVar230 + auVar311._4_4_ * (fVar346 * fVar367 + auVar16._4_4_ * auVar311._4_4_);
    auVar110._8_4_ =
         fVar300 * fVar231 + auVar311._8_4_ * (fVar348 * fVar300 + auVar16._8_4_ * auVar311._8_4_);
    auVar110._12_4_ =
         fVar301 * fVar331 +
         auVar311._12_4_ * (fVar355 * fVar301 + auVar16._12_4_ * auVar311._12_4_);
    auVar110._16_4_ =
         fVar302 * fVar332 + auVar311._16_4_ * (fVar345 * fVar302 + auVar16._0_4_ * auVar311._16_4_)
    ;
    auVar110._20_4_ =
         fVar303 * fVar333 + auVar311._20_4_ * (fVar346 * fVar303 + auVar16._4_4_ * auVar311._20_4_)
    ;
    auVar110._24_4_ =
         fVar304 * fVar338 + auVar311._24_4_ * (fVar348 * fVar304 + auVar16._8_4_ * auVar311._24_4_)
    ;
    auVar110._28_4_ = fVar206 + 1.0 + fVar344;
    auVar322._0_4_ =
         fVar364 * fVar357 + auVar311._0_4_ * (auVar73._0_4_ * auVar311._0_4_ + fVar364 * fVar184);
    auVar322._4_4_ =
         fVar367 * fVar361 + auVar311._4_4_ * (auVar73._4_4_ * auVar311._4_4_ + fVar367 * fVar186);
    auVar322._8_4_ =
         fVar300 * fVar366 + auVar311._8_4_ * (auVar73._8_4_ * auVar311._8_4_ + fVar300 * fVar205);
    auVar322._12_4_ =
         fVar301 * fVar362 +
         auVar311._12_4_ * (auVar73._12_4_ * auVar311._12_4_ + fVar301 * fVar207);
    auVar322._16_4_ =
         fVar302 * fVar334 + auVar311._16_4_ * (auVar73._0_4_ * auVar311._16_4_ + fVar302 * fVar184)
    ;
    auVar322._20_4_ =
         fVar303 * fVar335 + auVar311._20_4_ * (auVar73._4_4_ * auVar311._20_4_ + fVar303 * fVar186)
    ;
    auVar322._24_4_ =
         fVar304 * fVar336 + auVar311._24_4_ * (auVar73._8_4_ * auVar311._24_4_ + fVar304 * fVar205)
    ;
    auVar322._28_4_ = fVar344 + fVar207 + 0.0;
    local_98._0_4_ = fVar364 * auVar227._0_4_ + auVar311._0_4_ * auVar110._0_4_;
    local_98._4_4_ = fVar367 * auVar227._4_4_ + auVar311._4_4_ * auVar110._4_4_;
    local_98._8_4_ = fVar300 * auVar227._8_4_ + auVar311._8_4_ * auVar110._8_4_;
    local_98._12_4_ = fVar301 * auVar227._12_4_ + auVar311._12_4_ * auVar110._12_4_;
    local_98._16_4_ = fVar302 * auVar227._16_4_ + auVar311._16_4_ * auVar110._16_4_;
    local_98._20_4_ = fVar303 * auVar227._20_4_ + auVar311._20_4_ * auVar110._20_4_;
    local_98._24_4_ = fVar304 * auVar227._24_4_ + auVar311._24_4_ * auVar110._24_4_;
    local_98._28_4_ = fVar337 + fVar207 + 0.0;
    auVar203._0_4_ = fVar364 * auVar248._0_4_ + auVar311._0_4_ * auVar322._0_4_;
    auVar203._4_4_ = fVar367 * auVar248._4_4_ + auVar311._4_4_ * auVar322._4_4_;
    auVar203._8_4_ = fVar300 * auVar248._8_4_ + auVar311._8_4_ * auVar322._8_4_;
    auVar203._12_4_ = fVar301 * auVar248._12_4_ + auVar311._12_4_ * auVar322._12_4_;
    auVar203._16_4_ = fVar302 * auVar248._16_4_ + auVar311._16_4_ * auVar322._16_4_;
    auVar203._20_4_ = fVar303 * auVar248._20_4_ + auVar311._20_4_ * auVar322._20_4_;
    auVar203._24_4_ = fVar304 * auVar248._24_4_ + auVar311._24_4_ * auVar322._24_4_;
    auVar203._28_4_ = fVar337 + fVar344;
    auVar18 = vsubps_avx(auVar110,auVar227);
    auVar108 = vsubps_avx(auVar322,auVar248);
    local_4f8 = auVar83._0_4_;
    fStack_4f4 = auVar83._4_4_;
    fStack_4f0 = auVar83._8_4_;
    fStack_4ec = auVar83._12_4_;
    local_d8 = local_4f8 * auVar18._0_4_ * 3.0;
    fStack_d4 = fStack_4f4 * auVar18._4_4_ * 3.0;
    auVar19._4_4_ = fStack_d4;
    auVar19._0_4_ = local_d8;
    fStack_d0 = fStack_4f0 * auVar18._8_4_ * 3.0;
    auVar19._8_4_ = fStack_d0;
    fStack_cc = fStack_4ec * auVar18._12_4_ * 3.0;
    auVar19._12_4_ = fStack_cc;
    fStack_c8 = local_4f8 * auVar18._16_4_ * 3.0;
    auVar19._16_4_ = fStack_c8;
    fStack_c4 = fStack_4f4 * auVar18._20_4_ * 3.0;
    auVar19._20_4_ = fStack_c4;
    fStack_c0 = fStack_4f0 * auVar18._24_4_ * 3.0;
    auVar19._24_4_ = fStack_c0;
    auVar19._28_4_ = auVar18._28_4_;
    local_f8 = local_4f8 * auVar108._0_4_ * 3.0;
    fStack_f4 = fStack_4f4 * auVar108._4_4_ * 3.0;
    auVar20._4_4_ = fStack_f4;
    auVar20._0_4_ = local_f8;
    fStack_f0 = fStack_4f0 * auVar108._8_4_ * 3.0;
    auVar20._8_4_ = fStack_f0;
    fStack_ec = fStack_4ec * auVar108._12_4_ * 3.0;
    auVar20._12_4_ = fStack_ec;
    fStack_e8 = local_4f8 * auVar108._16_4_ * 3.0;
    auVar20._16_4_ = fStack_e8;
    fStack_e4 = fStack_4f4 * auVar108._20_4_ * 3.0;
    auVar20._20_4_ = fStack_e4;
    fStack_e0 = fStack_4f0 * auVar108._24_4_ * 3.0;
    auVar20._24_4_ = fStack_e0;
    auVar20._28_4_ = fVar337;
    auVar19 = vsubps_avx(local_98,auVar19);
    auVar108 = vperm2f128_avx(auVar19,auVar19,1);
    auVar108 = vshufps_avx(auVar108,auVar19,0x30);
    auVar108 = vshufps_avx(auVar19,auVar108,0x29);
    auVar20 = vsubps_avx(auVar203,auVar20);
    auVar19 = vperm2f128_avx(auVar20,auVar20,1);
    auVar19 = vshufps_avx(auVar19,auVar20,0x30);
    auVar20 = vshufps_avx(auVar20,auVar19,0x29);
    fVar335 = auVar168._0_4_;
    fVar336 = auVar168._4_4_;
    fVar365 = auVar168._8_4_;
    fVar206 = auVar84._12_4_;
    fVar346 = auVar130._0_4_;
    fVar355 = auVar130._4_4_;
    fVar357 = auVar130._8_4_;
    fVar361 = auVar130._12_4_;
    auVar83 = vshufps_avx(auVar272,auVar272,0xaa);
    fVar183 = auVar83._0_4_;
    fVar185 = auVar83._4_4_;
    fVar204 = auVar83._8_4_;
    fVar207 = auVar83._12_4_;
    fVar231 = auVar311._0_4_ * fVar183 + fVar335 * fVar364;
    fVar331 = auVar311._4_4_ * fVar185 + fVar336 * fVar367;
    fVar332 = auVar311._8_4_ * fVar204 + fVar365 * fVar300;
    fVar333 = auVar311._12_4_ * fVar207 + auVar168._12_4_ * fVar301;
    fVar338 = auVar311._16_4_ * fVar183 + fVar335 * fVar302;
    fVar344 = auVar311._20_4_ * fVar185 + fVar336 * fVar303;
    fVar345 = auVar311._24_4_ * fVar204 + fVar365 * fVar304;
    auVar83 = vshufps_avx(auVar272,auVar272,0xff);
    fVar184 = auVar83._0_4_;
    fVar186 = auVar83._4_4_;
    fVar205 = auVar83._8_4_;
    fVar229 = auVar83._12_4_;
    fVar348 = auVar311._0_4_ * fVar184 + fVar346 * fVar364;
    fVar356 = auVar311._4_4_ * fVar186 + fVar355 * fVar367;
    fVar358 = auVar311._8_4_ * fVar205 + fVar357 * fVar300;
    fVar363 = auVar311._12_4_ * fVar229 + fVar361 * fVar301;
    fVar366 = auVar311._16_4_ * fVar184 + fVar346 * fVar302;
    fVar359 = auVar311._20_4_ * fVar186 + fVar355 * fVar303;
    fVar362 = auVar311._24_4_ * fVar205 + fVar357 * fVar304;
    auVar83 = vshufps_avx(auVar215,auVar215,0xaa);
    fVar334 = auVar83._12_4_ + fVar207;
    auVar178 = vshufps_avx(auVar215,auVar215,0xff);
    fVar230 = auVar178._12_4_;
    auVar111._0_4_ =
         fVar364 * (fVar335 * auVar311._0_4_ + fVar364 * auVar84._0_4_) + auVar311._0_4_ * fVar231;
    auVar111._4_4_ =
         fVar367 * (fVar336 * auVar311._4_4_ + fVar367 * auVar84._4_4_) + auVar311._4_4_ * fVar331;
    auVar111._8_4_ =
         fVar300 * (fVar365 * auVar311._8_4_ + fVar300 * auVar84._8_4_) + auVar311._8_4_ * fVar332;
    auVar111._12_4_ =
         fVar301 * (auVar168._12_4_ * auVar311._12_4_ + fVar301 * fVar206) +
         auVar311._12_4_ * fVar333;
    auVar111._16_4_ =
         fVar302 * (fVar335 * auVar311._16_4_ + fVar302 * auVar84._0_4_) + auVar311._16_4_ * fVar338
    ;
    auVar111._20_4_ =
         fVar303 * (fVar336 * auVar311._20_4_ + fVar303 * auVar84._4_4_) + auVar311._20_4_ * fVar344
    ;
    auVar111._24_4_ =
         fVar304 * (fVar365 * auVar311._24_4_ + fVar304 * auVar84._8_4_) + auVar311._24_4_ * fVar345
    ;
    auVar111._28_4_ = auVar20._28_4_ + fVar206 + fVar230;
    auVar146._0_4_ =
         fVar364 * (fVar346 * auVar311._0_4_ + auVar129._0_4_ * fVar364) + auVar311._0_4_ * fVar348;
    auVar146._4_4_ =
         fVar367 * (fVar355 * auVar311._4_4_ + auVar129._4_4_ * fVar367) + auVar311._4_4_ * fVar356;
    auVar146._8_4_ =
         fVar300 * (fVar357 * auVar311._8_4_ + auVar129._8_4_ * fVar300) + auVar311._8_4_ * fVar358;
    auVar146._12_4_ =
         fVar301 * (fVar361 * auVar311._12_4_ + auVar129._12_4_ * fVar301) +
         auVar311._12_4_ * fVar363;
    auVar146._16_4_ =
         fVar302 * (fVar346 * auVar311._16_4_ + auVar129._0_4_ * fVar302) +
         auVar311._16_4_ * fVar366;
    auVar146._20_4_ =
         fVar303 * (fVar355 * auVar311._20_4_ + auVar129._4_4_ * fVar303) +
         auVar311._20_4_ * fVar359;
    auVar146._24_4_ =
         fVar304 * (fVar357 * auVar311._24_4_ + auVar129._8_4_ * fVar304) +
         auVar311._24_4_ * fVar362;
    auVar146._28_4_ = fVar206 + auVar19._28_4_ + fVar230;
    auVar19 = vperm2f128_avx(local_98,local_98,1);
    auVar19 = vshufps_avx(auVar19,local_98,0x30);
    auVar109 = vshufps_avx(local_98,auVar19,0x29);
    auVar249._0_4_ =
         auVar311._0_4_ * (auVar83._0_4_ * auVar311._0_4_ + fVar364 * fVar183) + fVar364 * fVar231;
    auVar249._4_4_ =
         auVar311._4_4_ * (auVar83._4_4_ * auVar311._4_4_ + fVar367 * fVar185) + fVar367 * fVar331;
    auVar249._8_4_ =
         auVar311._8_4_ * (auVar83._8_4_ * auVar311._8_4_ + fVar300 * fVar204) + fVar300 * fVar332;
    auVar249._12_4_ =
         auVar311._12_4_ * (auVar83._12_4_ * auVar311._12_4_ + fVar301 * fVar207) +
         fVar301 * fVar333;
    auVar249._16_4_ =
         auVar311._16_4_ * (auVar83._0_4_ * auVar311._16_4_ + fVar302 * fVar183) + fVar302 * fVar338
    ;
    auVar249._20_4_ =
         auVar311._20_4_ * (auVar83._4_4_ * auVar311._20_4_ + fVar303 * fVar185) + fVar303 * fVar344
    ;
    auVar249._24_4_ =
         auVar311._24_4_ * (auVar83._8_4_ * auVar311._24_4_ + fVar304 * fVar204) + fVar304 * fVar345
    ;
    auVar249._28_4_ = fVar334 + fVar347 + auVar248._28_4_;
    auVar289._0_4_ =
         fVar364 * fVar348 + auVar311._0_4_ * (auVar311._0_4_ * auVar178._0_4_ + fVar364 * fVar184);
    auVar289._4_4_ =
         fVar367 * fVar356 + auVar311._4_4_ * (auVar311._4_4_ * auVar178._4_4_ + fVar367 * fVar186);
    auVar289._8_4_ =
         fVar300 * fVar358 + auVar311._8_4_ * (auVar311._8_4_ * auVar178._8_4_ + fVar300 * fVar205);
    auVar289._12_4_ =
         fVar301 * fVar363 + auVar311._12_4_ * (auVar311._12_4_ * fVar230 + fVar301 * fVar229);
    auVar289._16_4_ =
         fVar302 * fVar366 +
         auVar311._16_4_ * (auVar311._16_4_ * auVar178._0_4_ + fVar302 * fVar184);
    auVar289._20_4_ =
         fVar303 * fVar359 +
         auVar311._20_4_ * (auVar311._20_4_ * auVar178._4_4_ + fVar303 * fVar186);
    auVar289._24_4_ =
         fVar304 * fVar362 +
         auVar311._24_4_ * (auVar311._24_4_ * auVar178._8_4_ + fVar304 * fVar205);
    auVar289._28_4_ = fVar347 + fVar361 + fVar230 + fVar229;
    auVar274._0_4_ = fVar364 * auVar111._0_4_ + auVar311._0_4_ * auVar249._0_4_;
    auVar274._4_4_ = fVar367 * auVar111._4_4_ + auVar311._4_4_ * auVar249._4_4_;
    auVar274._8_4_ = fVar300 * auVar111._8_4_ + auVar311._8_4_ * auVar249._8_4_;
    auVar274._12_4_ = fVar301 * auVar111._12_4_ + auVar311._12_4_ * auVar249._12_4_;
    auVar274._16_4_ = fVar302 * auVar111._16_4_ + auVar311._16_4_ * auVar249._16_4_;
    auVar274._20_4_ = fVar303 * auVar111._20_4_ + auVar311._20_4_ * auVar249._20_4_;
    auVar274._24_4_ = fVar304 * auVar111._24_4_ + auVar311._24_4_ * auVar249._24_4_;
    auVar274._28_4_ = fVar334 + fVar230 + fVar229;
    auVar299._0_4_ = fVar364 * auVar146._0_4_ + auVar311._0_4_ * auVar289._0_4_;
    auVar299._4_4_ = fVar367 * auVar146._4_4_ + auVar311._4_4_ * auVar289._4_4_;
    auVar299._8_4_ = fVar300 * auVar146._8_4_ + auVar311._8_4_ * auVar289._8_4_;
    auVar299._12_4_ = fVar301 * auVar146._12_4_ + auVar311._12_4_ * auVar289._12_4_;
    auVar299._16_4_ = fVar302 * auVar146._16_4_ + auVar311._16_4_ * auVar289._16_4_;
    auVar299._20_4_ = fVar303 * auVar146._20_4_ + auVar311._20_4_ * auVar289._20_4_;
    auVar299._24_4_ = fVar304 * auVar146._24_4_ + auVar311._24_4_ * auVar289._24_4_;
    auVar299._28_4_ = auVar17._28_4_ + auVar311._28_4_;
    auVar21 = vsubps_avx(auVar249,auVar111);
    auVar19 = vsubps_avx(auVar289,auVar146);
    local_118 = local_4f8 * auVar21._0_4_ * 3.0;
    fStack_114 = fStack_4f4 * auVar21._4_4_ * 3.0;
    auVar17._4_4_ = fStack_114;
    auVar17._0_4_ = local_118;
    fStack_110 = fStack_4f0 * auVar21._8_4_ * 3.0;
    auVar17._8_4_ = fStack_110;
    fStack_10c = fStack_4ec * auVar21._12_4_ * 3.0;
    auVar17._12_4_ = fStack_10c;
    fStack_108 = local_4f8 * auVar21._16_4_ * 3.0;
    auVar17._16_4_ = fStack_108;
    fStack_104 = fStack_4f4 * auVar21._20_4_ * 3.0;
    auVar17._20_4_ = fStack_104;
    fStack_100 = fStack_4f0 * auVar21._24_4_ * 3.0;
    auVar17._24_4_ = fStack_100;
    auVar17._28_4_ = auVar21._28_4_;
    local_138 = local_4f8 * auVar19._0_4_ * 3.0;
    fStack_134 = fStack_4f4 * auVar19._4_4_ * 3.0;
    auVar22._4_4_ = fStack_134;
    auVar22._0_4_ = local_138;
    fStack_130 = fStack_4f0 * auVar19._8_4_ * 3.0;
    auVar22._8_4_ = fStack_130;
    fStack_12c = fStack_4ec * auVar19._12_4_ * 3.0;
    auVar22._12_4_ = fStack_12c;
    fStack_128 = local_4f8 * auVar19._16_4_ * 3.0;
    auVar22._16_4_ = fStack_128;
    fStack_124 = fStack_4f4 * auVar19._20_4_ * 3.0;
    auVar22._20_4_ = fStack_124;
    fStack_120 = fStack_4f0 * auVar19._24_4_ * 3.0;
    auVar22._24_4_ = fStack_120;
    auVar22._28_4_ = auVar249._28_4_;
    auVar19 = vperm2f128_avx(auVar274,auVar274,1);
    auVar19 = vshufps_avx(auVar19,auVar274,0x30);
    auVar110 = vshufps_avx(auVar274,auVar19,0x29);
    auVar17 = vsubps_avx(auVar274,auVar17);
    auVar19 = vperm2f128_avx(auVar17,auVar17,1);
    auVar19 = vshufps_avx(auVar19,auVar17,0x30);
    auVar19 = vshufps_avx(auVar17,auVar19,0x29);
    auVar22 = vsubps_avx(auVar299,auVar22);
    auVar17 = vperm2f128_avx(auVar22,auVar22,1);
    auVar17 = vshufps_avx(auVar17,auVar22,0x30);
    auVar22 = vshufps_avx(auVar22,auVar17,0x29);
    auVar23 = vsubps_avx(auVar274,local_98);
    auVar111 = vsubps_avx(auVar110,auVar109);
    fVar183 = auVar111._0_4_ + auVar23._0_4_;
    fVar184 = auVar111._4_4_ + auVar23._4_4_;
    fVar185 = auVar111._8_4_ + auVar23._8_4_;
    fVar186 = auVar111._12_4_ + auVar23._12_4_;
    fVar204 = auVar111._16_4_ + auVar23._16_4_;
    fVar205 = auVar111._20_4_ + auVar23._20_4_;
    fVar206 = auVar111._24_4_ + auVar23._24_4_;
    auVar17 = vperm2f128_avx(auVar203,auVar203,1);
    auVar17 = vshufps_avx(auVar17,auVar203,0x30);
    local_b8 = vshufps_avx(auVar203,auVar17,0x29);
    auVar17 = vperm2f128_avx(auVar299,auVar299,1);
    auVar17 = vshufps_avx(auVar17,auVar299,0x30);
    local_378 = vshufps_avx(auVar299,auVar17,0x29);
    auVar17 = vsubps_avx(auVar299,auVar203);
    auVar146 = vsubps_avx(local_378,local_b8);
    fVar207 = auVar146._0_4_ + auVar17._0_4_;
    fVar229 = auVar146._4_4_ + auVar17._4_4_;
    fVar230 = auVar146._8_4_ + auVar17._8_4_;
    fVar231 = auVar146._12_4_ + auVar17._12_4_;
    fVar331 = auVar146._16_4_ + auVar17._16_4_;
    fVar332 = auVar146._20_4_ + auVar17._20_4_;
    fVar333 = auVar146._24_4_ + auVar17._24_4_;
    auVar24._4_4_ = fVar184 * auVar203._4_4_;
    auVar24._0_4_ = fVar183 * auVar203._0_4_;
    auVar24._8_4_ = fVar185 * auVar203._8_4_;
    auVar24._12_4_ = fVar186 * auVar203._12_4_;
    auVar24._16_4_ = fVar204 * auVar203._16_4_;
    auVar24._20_4_ = fVar205 * auVar203._20_4_;
    auVar24._24_4_ = fVar206 * auVar203._24_4_;
    auVar24._28_4_ = auVar17._28_4_;
    auVar25._4_4_ = fVar229 * local_98._4_4_;
    auVar25._0_4_ = fVar207 * local_98._0_4_;
    auVar25._8_4_ = fVar230 * local_98._8_4_;
    auVar25._12_4_ = fVar231 * local_98._12_4_;
    auVar25._16_4_ = fVar331 * local_98._16_4_;
    auVar25._20_4_ = fVar332 * local_98._20_4_;
    auVar25._24_4_ = fVar333 * local_98._24_4_;
    auVar25._28_4_ = fVar334;
    auVar24 = vsubps_avx(auVar24,auVar25);
    local_d8 = local_98._0_4_ + local_d8;
    fStack_d4 = local_98._4_4_ + fStack_d4;
    fStack_d0 = local_98._8_4_ + fStack_d0;
    fStack_cc = local_98._12_4_ + fStack_cc;
    fStack_c8 = local_98._16_4_ + fStack_c8;
    fStack_c4 = local_98._20_4_ + fStack_c4;
    fStack_c0 = local_98._24_4_ + fStack_c0;
    fStack_bc = local_98._28_4_ + auVar18._28_4_;
    local_f8 = local_f8 + auVar203._0_4_;
    fStack_f4 = fStack_f4 + auVar203._4_4_;
    fStack_f0 = fStack_f0 + auVar203._8_4_;
    fStack_ec = fStack_ec + auVar203._12_4_;
    fStack_e8 = fStack_e8 + auVar203._16_4_;
    fStack_e4 = fStack_e4 + auVar203._20_4_;
    fStack_e0 = fStack_e0 + auVar203._24_4_;
    fStack_dc = fVar337 + auVar203._28_4_;
    auVar18._4_4_ = fVar184 * fStack_f4;
    auVar18._0_4_ = fVar183 * local_f8;
    auVar18._8_4_ = fVar185 * fStack_f0;
    auVar18._12_4_ = fVar186 * fStack_ec;
    auVar18._16_4_ = fVar204 * fStack_e8;
    auVar18._20_4_ = fVar205 * fStack_e4;
    auVar18._24_4_ = fVar206 * fStack_e0;
    auVar18._28_4_ = fVar337;
    auVar26._4_4_ = fVar229 * fStack_d4;
    auVar26._0_4_ = fVar207 * local_d8;
    auVar26._8_4_ = fVar230 * fStack_d0;
    auVar26._12_4_ = fVar231 * fStack_cc;
    auVar26._16_4_ = fVar331 * fStack_c8;
    auVar26._20_4_ = fVar332 * fStack_c4;
    auVar26._24_4_ = fVar333 * fStack_c0;
    auVar26._28_4_ = fVar337 + auVar203._28_4_;
    auVar18 = vsubps_avx(auVar18,auVar26);
    local_548 = auVar20._0_4_;
    fStack_544 = auVar20._4_4_;
    fStack_540 = auVar20._8_4_;
    fStack_53c = auVar20._12_4_;
    fStack_538 = auVar20._16_4_;
    fStack_534 = auVar20._20_4_;
    fStack_530 = auVar20._24_4_;
    auVar27._4_4_ = fVar184 * fStack_544;
    auVar27._0_4_ = fVar183 * local_548;
    auVar27._8_4_ = fVar185 * fStack_540;
    auVar27._12_4_ = fVar186 * fStack_53c;
    auVar27._16_4_ = fVar204 * fStack_538;
    auVar27._20_4_ = fVar205 * fStack_534;
    auVar27._24_4_ = fVar206 * fStack_530;
    auVar27._28_4_ = fVar337;
    local_528._0_4_ = auVar108._0_4_;
    local_528._4_4_ = auVar108._4_4_;
    fStack_520 = auVar108._8_4_;
    fStack_51c = auVar108._12_4_;
    fStack_518 = auVar108._16_4_;
    fStack_514 = auVar108._20_4_;
    fStack_510 = auVar108._24_4_;
    auVar28._4_4_ = fVar229 * (float)local_528._4_4_;
    auVar28._0_4_ = fVar207 * (float)local_528._0_4_;
    auVar28._8_4_ = fVar230 * fStack_520;
    auVar28._12_4_ = fVar231 * fStack_51c;
    auVar28._16_4_ = fVar331 * fStack_518;
    auVar28._20_4_ = fVar332 * fStack_514;
    auVar28._24_4_ = fVar333 * fStack_510;
    auVar28._28_4_ = local_98._28_4_;
    auVar25 = vsubps_avx(auVar27,auVar28);
    auVar29._4_4_ = local_b8._4_4_ * fVar184;
    auVar29._0_4_ = local_b8._0_4_ * fVar183;
    auVar29._8_4_ = local_b8._8_4_ * fVar185;
    auVar29._12_4_ = local_b8._12_4_ * fVar186;
    auVar29._16_4_ = local_b8._16_4_ * fVar204;
    auVar29._20_4_ = local_b8._20_4_ * fVar205;
    auVar29._24_4_ = local_b8._24_4_ * fVar206;
    auVar29._28_4_ = fVar337;
    auVar30._4_4_ = auVar109._4_4_ * fVar229;
    auVar30._0_4_ = auVar109._0_4_ * fVar207;
    auVar30._8_4_ = auVar109._8_4_ * fVar230;
    auVar30._12_4_ = auVar109._12_4_ * fVar231;
    auVar30._16_4_ = auVar109._16_4_ * fVar331;
    auVar30._20_4_ = auVar109._20_4_ * fVar332;
    auVar30._24_4_ = auVar109._24_4_ * fVar333;
    auVar30._28_4_ = local_b8._28_4_;
    local_4f8 = auVar19._0_4_;
    fStack_4f4 = auVar19._4_4_;
    fStack_4f0 = auVar19._8_4_;
    fStack_4ec = auVar19._12_4_;
    fStack_4e8 = auVar19._16_4_;
    fStack_4e4 = auVar19._20_4_;
    fStack_4e0 = auVar19._24_4_;
    auVar26 = vsubps_avx(auVar29,auVar30);
    auVar31._4_4_ = auVar299._4_4_ * fVar184;
    auVar31._0_4_ = auVar299._0_4_ * fVar183;
    auVar31._8_4_ = auVar299._8_4_ * fVar185;
    auVar31._12_4_ = auVar299._12_4_ * fVar186;
    auVar31._16_4_ = auVar299._16_4_ * fVar204;
    auVar31._20_4_ = auVar299._20_4_ * fVar205;
    auVar31._24_4_ = auVar299._24_4_ * fVar206;
    auVar31._28_4_ = fVar337;
    auVar32._4_4_ = fVar229 * auVar274._4_4_;
    auVar32._0_4_ = fVar207 * auVar274._0_4_;
    auVar32._8_4_ = fVar230 * auVar274._8_4_;
    auVar32._12_4_ = fVar231 * auVar274._12_4_;
    auVar32._16_4_ = fVar331 * auVar274._16_4_;
    auVar32._20_4_ = fVar332 * auVar274._20_4_;
    auVar32._24_4_ = fVar333 * auVar274._24_4_;
    auVar32._28_4_ = fStack_bc;
    auVar27 = vsubps_avx(auVar31,auVar32);
    local_118 = auVar274._0_4_ + local_118;
    fStack_114 = auVar274._4_4_ + fStack_114;
    fStack_110 = auVar274._8_4_ + fStack_110;
    fStack_10c = auVar274._12_4_ + fStack_10c;
    fStack_108 = auVar274._16_4_ + fStack_108;
    fStack_104 = auVar274._20_4_ + fStack_104;
    fStack_100 = auVar274._24_4_ + fStack_100;
    fStack_fc = auVar274._28_4_ + auVar21._28_4_;
    local_138 = auVar299._0_4_ + local_138;
    fStack_134 = auVar299._4_4_ + fStack_134;
    fStack_130 = auVar299._8_4_ + fStack_130;
    fStack_12c = auVar299._12_4_ + fStack_12c;
    fStack_128 = auVar299._16_4_ + fStack_128;
    fStack_124 = auVar299._20_4_ + fStack_124;
    fStack_120 = auVar299._24_4_ + fStack_120;
    fStack_11c = auVar299._28_4_ + auVar249._28_4_;
    auVar21._4_4_ = fVar184 * fStack_134;
    auVar21._0_4_ = fVar183 * local_138;
    auVar21._8_4_ = fVar185 * fStack_130;
    auVar21._12_4_ = fVar186 * fStack_12c;
    auVar21._16_4_ = fVar204 * fStack_128;
    auVar21._20_4_ = fVar205 * fStack_124;
    auVar21._24_4_ = fVar206 * fStack_120;
    auVar21._28_4_ = auVar299._28_4_ + auVar249._28_4_;
    auVar33._4_4_ = fStack_114 * fVar229;
    auVar33._0_4_ = local_118 * fVar207;
    auVar33._8_4_ = fStack_110 * fVar230;
    auVar33._12_4_ = fStack_10c * fVar231;
    auVar33._16_4_ = fStack_108 * fVar331;
    auVar33._20_4_ = fStack_104 * fVar332;
    auVar33._24_4_ = fStack_100 * fVar333;
    auVar33._28_4_ = fStack_fc;
    auVar21 = vsubps_avx(auVar21,auVar33);
    auVar34._4_4_ = fVar184 * auVar22._4_4_;
    auVar34._0_4_ = fVar183 * auVar22._0_4_;
    auVar34._8_4_ = fVar185 * auVar22._8_4_;
    auVar34._12_4_ = fVar186 * auVar22._12_4_;
    auVar34._16_4_ = fVar204 * auVar22._16_4_;
    auVar34._20_4_ = fVar205 * auVar22._20_4_;
    auVar34._24_4_ = fVar206 * auVar22._24_4_;
    auVar34._28_4_ = fStack_fc;
    auVar35._4_4_ = fVar229 * fStack_4f4;
    auVar35._0_4_ = fVar207 * local_4f8;
    auVar35._8_4_ = fVar230 * fStack_4f0;
    auVar35._12_4_ = fVar231 * fStack_4ec;
    auVar35._16_4_ = fVar331 * fStack_4e8;
    auVar35._20_4_ = fVar332 * fStack_4e4;
    auVar35._24_4_ = fVar333 * fStack_4e0;
    auVar35._28_4_ = auVar22._28_4_;
    auVar28 = vsubps_avx(auVar34,auVar35);
    auVar36._4_4_ = fVar184 * local_378._4_4_;
    auVar36._0_4_ = fVar183 * local_378._0_4_;
    auVar36._8_4_ = fVar185 * local_378._8_4_;
    auVar36._12_4_ = fVar186 * local_378._12_4_;
    auVar36._16_4_ = fVar204 * local_378._16_4_;
    auVar36._20_4_ = fVar205 * local_378._20_4_;
    auVar36._24_4_ = fVar206 * local_378._24_4_;
    auVar36._28_4_ = auVar111._28_4_ + auVar23._28_4_;
    auVar23._4_4_ = auVar110._4_4_ * fVar229;
    auVar23._0_4_ = auVar110._0_4_ * fVar207;
    auVar23._8_4_ = auVar110._8_4_ * fVar230;
    auVar23._12_4_ = auVar110._12_4_ * fVar231;
    auVar23._16_4_ = auVar110._16_4_ * fVar331;
    auVar23._20_4_ = auVar110._20_4_ * fVar332;
    auVar23._24_4_ = auVar110._24_4_ * fVar333;
    auVar23._28_4_ = auVar146._28_4_ + auVar17._28_4_;
    auVar23 = vsubps_avx(auVar36,auVar23);
    auVar19 = vminps_avx(auVar24,auVar18);
    auVar108 = vmaxps_avx(auVar24,auVar18);
    auVar20 = vminps_avx(auVar25,auVar26);
    auVar20 = vminps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar25,auVar26);
    auVar108 = vmaxps_avx(auVar108,auVar19);
    auVar17 = vminps_avx(auVar27,auVar21);
    auVar19 = vmaxps_avx(auVar27,auVar21);
    auVar18 = vminps_avx(auVar28,auVar23);
    auVar18 = vminps_avx(auVar17,auVar18);
    auVar18 = vminps_avx(auVar20,auVar18);
    auVar20 = vmaxps_avx(auVar28,auVar23);
    auVar19 = vmaxps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar108,auVar19);
    auVar108 = vcmpps_avx(auVar18,local_78,2);
    auVar19 = vcmpps_avx(auVar19,local_228,5);
    auVar108 = vandps_avx(auVar19,auVar108);
    auVar19 = local_158 & auVar108;
    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0x7f,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar19 >> 0xbf,0) != '\0') ||
        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar19[0x1f] < '\0')
    {
      auVar19 = vsubps_avx(auVar109,local_98);
      auVar20 = vsubps_avx(auVar110,auVar274);
      fVar184 = auVar19._0_4_ + auVar20._0_4_;
      fVar185 = auVar19._4_4_ + auVar20._4_4_;
      fVar186 = auVar19._8_4_ + auVar20._8_4_;
      fVar204 = auVar19._12_4_ + auVar20._12_4_;
      fVar205 = auVar19._16_4_ + auVar20._16_4_;
      fVar206 = auVar19._20_4_ + auVar20._20_4_;
      fVar207 = auVar19._24_4_ + auVar20._24_4_;
      auVar18 = vsubps_avx(local_b8,auVar203);
      auVar21 = vsubps_avx(local_378,auVar299);
      fVar229 = auVar18._0_4_ + auVar21._0_4_;
      fVar230 = auVar18._4_4_ + auVar21._4_4_;
      fVar231 = auVar18._8_4_ + auVar21._8_4_;
      fVar331 = auVar18._12_4_ + auVar21._12_4_;
      fVar332 = auVar18._16_4_ + auVar21._16_4_;
      fVar333 = auVar18._20_4_ + auVar21._20_4_;
      fVar338 = auVar18._24_4_ + auVar21._24_4_;
      fVar183 = auVar21._28_4_;
      auVar37._4_4_ = auVar203._4_4_ * fVar185;
      auVar37._0_4_ = auVar203._0_4_ * fVar184;
      auVar37._8_4_ = auVar203._8_4_ * fVar186;
      auVar37._12_4_ = auVar203._12_4_ * fVar204;
      auVar37._16_4_ = auVar203._16_4_ * fVar205;
      auVar37._20_4_ = auVar203._20_4_ * fVar206;
      auVar37._24_4_ = auVar203._24_4_ * fVar207;
      auVar37._28_4_ = auVar203._28_4_;
      auVar38._4_4_ = local_98._4_4_ * fVar230;
      auVar38._0_4_ = local_98._0_4_ * fVar229;
      auVar38._8_4_ = local_98._8_4_ * fVar231;
      auVar38._12_4_ = local_98._12_4_ * fVar331;
      auVar38._16_4_ = local_98._16_4_ * fVar332;
      auVar38._20_4_ = local_98._20_4_ * fVar333;
      auVar38._24_4_ = local_98._24_4_ * fVar338;
      auVar38._28_4_ = local_98._28_4_;
      auVar21 = vsubps_avx(auVar37,auVar38);
      auVar39._4_4_ = fVar185 * fStack_f4;
      auVar39._0_4_ = fVar184 * local_f8;
      auVar39._8_4_ = fVar186 * fStack_f0;
      auVar39._12_4_ = fVar204 * fStack_ec;
      auVar39._16_4_ = fVar205 * fStack_e8;
      auVar39._20_4_ = fVar206 * fStack_e4;
      auVar39._24_4_ = fVar207 * fStack_e0;
      auVar39._28_4_ = auVar203._28_4_;
      auVar40._4_4_ = fVar230 * fStack_d4;
      auVar40._0_4_ = fVar229 * local_d8;
      auVar40._8_4_ = fVar231 * fStack_d0;
      auVar40._12_4_ = fVar331 * fStack_cc;
      auVar40._16_4_ = fVar332 * fStack_c8;
      auVar40._20_4_ = fVar333 * fStack_c4;
      auVar40._24_4_ = fVar338 * fStack_c0;
      auVar40._28_4_ = fVar183;
      auVar23 = vsubps_avx(auVar39,auVar40);
      auVar41._4_4_ = fVar185 * fStack_544;
      auVar41._0_4_ = fVar184 * local_548;
      auVar41._8_4_ = fVar186 * fStack_540;
      auVar41._12_4_ = fVar204 * fStack_53c;
      auVar41._16_4_ = fVar205 * fStack_538;
      auVar41._20_4_ = fVar206 * fStack_534;
      auVar41._24_4_ = fVar207 * fStack_530;
      auVar41._28_4_ = fVar183;
      auVar42._4_4_ = fVar230 * (float)local_528._4_4_;
      auVar42._0_4_ = fVar229 * (float)local_528._0_4_;
      auVar42._8_4_ = fVar231 * fStack_520;
      auVar42._12_4_ = fVar331 * fStack_51c;
      auVar42._16_4_ = fVar332 * fStack_518;
      auVar42._20_4_ = fVar333 * fStack_514;
      auVar42._24_4_ = fVar338 * fStack_510;
      auVar42._28_4_ = auVar17._28_4_;
      auVar111 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = local_b8._4_4_ * fVar185;
      auVar43._0_4_ = local_b8._0_4_ * fVar184;
      auVar43._8_4_ = local_b8._8_4_ * fVar186;
      auVar43._12_4_ = local_b8._12_4_ * fVar204;
      auVar43._16_4_ = local_b8._16_4_ * fVar205;
      auVar43._20_4_ = local_b8._20_4_ * fVar206;
      auVar43._24_4_ = local_b8._24_4_ * fVar207;
      auVar43._28_4_ = auVar17._28_4_;
      auVar44._4_4_ = auVar109._4_4_ * fVar230;
      auVar44._0_4_ = auVar109._0_4_ * fVar229;
      auVar44._8_4_ = auVar109._8_4_ * fVar231;
      auVar44._12_4_ = auVar109._12_4_ * fVar331;
      auVar44._16_4_ = auVar109._16_4_ * fVar332;
      auVar44._20_4_ = auVar109._20_4_ * fVar333;
      uVar4 = auVar109._28_4_;
      auVar44._24_4_ = auVar109._24_4_ * fVar338;
      auVar44._28_4_ = uVar4;
      auVar109 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = auVar299._4_4_ * fVar185;
      auVar45._0_4_ = auVar299._0_4_ * fVar184;
      auVar45._8_4_ = auVar299._8_4_ * fVar186;
      auVar45._12_4_ = auVar299._12_4_ * fVar204;
      auVar45._16_4_ = auVar299._16_4_ * fVar205;
      auVar45._20_4_ = auVar299._20_4_ * fVar206;
      auVar45._24_4_ = auVar299._24_4_ * fVar207;
      auVar45._28_4_ = uVar4;
      auVar46._4_4_ = auVar274._4_4_ * fVar230;
      auVar46._0_4_ = auVar274._0_4_ * fVar229;
      auVar46._8_4_ = auVar274._8_4_ * fVar231;
      auVar46._12_4_ = auVar274._12_4_ * fVar331;
      auVar46._16_4_ = auVar274._16_4_ * fVar332;
      auVar46._20_4_ = auVar274._20_4_ * fVar333;
      auVar46._24_4_ = auVar274._24_4_ * fVar338;
      auVar46._28_4_ = auVar274._28_4_;
      auVar146 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = fVar185 * fStack_134;
      auVar47._0_4_ = fVar184 * local_138;
      auVar47._8_4_ = fVar186 * fStack_130;
      auVar47._12_4_ = fVar204 * fStack_12c;
      auVar47._16_4_ = fVar205 * fStack_128;
      auVar47._20_4_ = fVar206 * fStack_124;
      auVar47._24_4_ = fVar207 * fStack_120;
      auVar47._28_4_ = uVar4;
      auVar48._4_4_ = fVar230 * fStack_114;
      auVar48._0_4_ = fVar229 * local_118;
      auVar48._8_4_ = fVar231 * fStack_110;
      auVar48._12_4_ = fVar331 * fStack_10c;
      auVar48._16_4_ = fVar332 * fStack_108;
      auVar48._20_4_ = fVar333 * fStack_104;
      auVar48._24_4_ = fVar338 * fStack_100;
      auVar48._28_4_ = auVar299._28_4_;
      auVar24 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = fVar185 * auVar22._4_4_;
      auVar49._0_4_ = fVar184 * auVar22._0_4_;
      auVar49._8_4_ = fVar186 * auVar22._8_4_;
      auVar49._12_4_ = fVar204 * auVar22._12_4_;
      auVar49._16_4_ = fVar205 * auVar22._16_4_;
      auVar49._20_4_ = fVar206 * auVar22._20_4_;
      auVar49._24_4_ = fVar207 * auVar22._24_4_;
      auVar49._28_4_ = auVar299._28_4_;
      auVar50._4_4_ = fStack_4f4 * fVar230;
      auVar50._0_4_ = local_4f8 * fVar229;
      auVar50._8_4_ = fStack_4f0 * fVar231;
      auVar50._12_4_ = fStack_4ec * fVar331;
      auVar50._16_4_ = fStack_4e8 * fVar332;
      auVar50._20_4_ = fStack_4e4 * fVar333;
      auVar50._24_4_ = fStack_4e0 * fVar338;
      auVar50._28_4_ = local_b8._28_4_;
      auVar22 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = local_378._4_4_ * fVar185;
      auVar51._0_4_ = local_378._0_4_ * fVar184;
      auVar51._8_4_ = local_378._8_4_ * fVar186;
      auVar51._12_4_ = local_378._12_4_ * fVar204;
      auVar51._16_4_ = local_378._16_4_ * fVar205;
      auVar51._20_4_ = local_378._20_4_ * fVar206;
      auVar51._24_4_ = local_378._24_4_ * fVar207;
      auVar51._28_4_ = auVar19._28_4_ + auVar20._28_4_;
      auVar52._4_4_ = auVar110._4_4_ * fVar230;
      auVar52._0_4_ = auVar110._0_4_ * fVar229;
      auVar52._8_4_ = auVar110._8_4_ * fVar231;
      auVar52._12_4_ = auVar110._12_4_ * fVar331;
      auVar52._16_4_ = auVar110._16_4_ * fVar332;
      auVar52._20_4_ = auVar110._20_4_ * fVar333;
      auVar52._24_4_ = auVar110._24_4_ * fVar338;
      auVar52._28_4_ = auVar18._28_4_ + fVar183;
      auVar110 = vsubps_avx(auVar51,auVar52);
      auVar20 = vminps_avx(auVar21,auVar23);
      auVar19 = vmaxps_avx(auVar21,auVar23);
      auVar17 = vminps_avx(auVar111,auVar109);
      auVar17 = vminps_avx(auVar20,auVar17);
      auVar20 = vmaxps_avx(auVar111,auVar109);
      auVar19 = vmaxps_avx(auVar19,auVar20);
      auVar18 = vminps_avx(auVar146,auVar24);
      auVar20 = vmaxps_avx(auVar146,auVar24);
      auVar109 = vminps_avx(auVar22,auVar110);
      auVar18 = vminps_avx(auVar18,auVar109);
      auVar18 = vminps_avx(auVar17,auVar18);
      auVar17 = vmaxps_avx(auVar22,auVar110);
      auVar20 = vmaxps_avx(auVar20,auVar17);
      auVar20 = vmaxps_avx(auVar19,auVar20);
      auVar19 = vcmpps_avx(auVar18,local_78,2);
      auVar20 = vcmpps_avx(auVar20,local_228,5);
      auVar19 = vandps_avx(auVar20,auVar19);
      auVar108 = vandps_avx(local_158,auVar108);
      auVar20 = auVar108 & auVar19;
      if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar20 >> 0x7f,0) != '\0') ||
            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0xbf,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar20[0x1f] < '\0') {
        auVar108 = vandps_avx(auVar19,auVar108);
        uVar70 = vmovmskps_avx(auVar108);
        if (uVar70 != 0) {
          uVar68 = (ulong)uVar69;
          auStack_3b8[uVar68] = uVar70 & 0xff;
          uVar5 = vmovlps_avx(local_2e8);
          *(undefined8 *)(afStack_208 + uVar68 * 2) = uVar5;
          uVar67 = vmovlps_avx(auVar93);
          auStack_58[uVar68] = uVar67;
          uVar69 = uVar69 + 1;
        }
      }
    }
LAB_00f88fbe:
    do {
      do {
        do {
          do {
            if (uVar69 == 0) {
              if ((uVar65 & 1) != 0) goto LAB_00f8a047;
              uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar107._4_4_ = uVar4;
              auVar107._0_4_ = uVar4;
              auVar107._8_4_ = uVar4;
              auVar107._12_4_ = uVar4;
              auVar83 = vcmpps_avx(local_2f8,auVar107,2);
              uVar64 = vmovmskps_avx(auVar83);
              uVar63 = uVar63 & uVar63 + 0xf & uVar64;
              if (uVar63 != 0) goto LAB_00f87ce7;
              goto LAB_00f8a047;
            }
            uVar68 = (ulong)(uVar69 - 1);
            uVar70 = auStack_3b8[uVar68];
            fVar183 = afStack_208[uVar68 * 2];
            fVar184 = afStack_208[uVar68 * 2 + 1];
            auVar93._8_8_ = 0;
            auVar93._0_8_ = auStack_58[uVar68];
            uVar67 = 0;
            if (uVar70 != 0) {
              for (; (uVar70 >> uVar67 & 1) == 0; uVar67 = uVar67 + 1) {
              }
            }
            uVar70 = uVar70 - 1 & uVar70;
            auStack_3b8[uVar68] = uVar70;
            if (uVar70 == 0) {
              uVar69 = uVar69 - 1;
            }
            fVar186 = (float)(uVar67 + 1) * 0.14285715;
            fVar185 = (1.0 - (float)uVar67 * 0.14285715) * fVar183 +
                      fVar184 * (float)uVar67 * 0.14285715;
            fVar183 = (1.0 - fVar186) * fVar183 + fVar184 * fVar186;
            fVar184 = fVar183 - fVar185;
            if (0.16666667 <= fVar184) {
              local_2e8 = vinsertps_avx(ZEXT416((uint)fVar185),ZEXT416((uint)fVar183),0x10);
              goto LAB_00f88989;
            }
            auVar83 = vshufps_avx(auVar93,auVar93,0x50);
            auVar127._8_4_ = 0x3f800000;
            auVar127._0_8_ = 0x3f8000003f800000;
            auVar127._12_4_ = 0x3f800000;
            auVar84 = vsubps_avx(auVar127,auVar83);
            fVar186 = auVar83._0_4_;
            fVar204 = auVar83._4_4_;
            fVar205 = auVar83._8_4_;
            fVar206 = auVar83._12_4_;
            fVar207 = auVar84._0_4_;
            fVar229 = auVar84._4_4_;
            fVar230 = auVar84._8_4_;
            fVar231 = auVar84._12_4_;
            auVar165._0_4_ = fVar186 * auVar284._0_4_ + fVar207 * fVar252;
            auVar165._4_4_ = fVar204 * auVar284._4_4_ + fVar229 * fVar324;
            auVar165._8_4_ = fVar205 * auVar284._0_4_ + fVar230 * fVar252;
            auVar165._12_4_ = fVar206 * auVar284._4_4_ + fVar231 * fVar324;
            auVar216._0_4_ = fVar186 * auVar292._0_4_ + fVar207 * auVar349._0_4_;
            auVar216._4_4_ = fVar204 * auVar292._4_4_ + fVar229 * auVar349._4_4_;
            auVar216._8_4_ = fVar205 * auVar292._0_4_ + fVar230 * auVar349._0_4_;
            auVar216._12_4_ = fVar206 * auVar292._4_4_ + fVar231 * auVar349._4_4_;
            auVar241._0_4_ = fVar186 * auVar308._0_4_ + auVar341._0_4_ * fVar207;
            auVar241._4_4_ = fVar204 * auVar308._4_4_ + auVar341._4_4_ * fVar229;
            auVar241._8_4_ = fVar205 * auVar308._0_4_ + auVar341._0_4_ * fVar230;
            auVar241._12_4_ = fVar206 * auVar308._4_4_ + auVar341._4_4_ * fVar231;
            auVar94._0_4_ = fVar186 * auVar91._0_4_ + fVar207 * auVar126._0_4_;
            auVar94._4_4_ = fVar204 * auVar91._4_4_ + fVar229 * auVar126._4_4_;
            auVar94._8_4_ = fVar205 * auVar91._0_4_ + fVar230 * auVar126._0_4_;
            auVar94._12_4_ = fVar206 * auVar91._4_4_ + fVar231 * auVar126._4_4_;
            auVar147._16_16_ = auVar165;
            auVar147._0_16_ = auVar165;
            auVar181._16_16_ = auVar216;
            auVar181._0_16_ = auVar216;
            auVar228._16_16_ = auVar241;
            auVar228._0_16_ = auVar241;
            auVar108 = ZEXT2032(CONCAT416(fVar183,ZEXT416((uint)fVar185)));
            auVar108 = vshufps_avx(auVar108,auVar108,0);
            auVar19 = vsubps_avx(auVar181,auVar147);
            fVar186 = auVar108._0_4_;
            fVar204 = auVar108._4_4_;
            fVar205 = auVar108._8_4_;
            fVar206 = auVar108._12_4_;
            fVar207 = auVar108._16_4_;
            fVar229 = auVar108._20_4_;
            fVar230 = auVar108._24_4_;
            auVar148._0_4_ = auVar165._0_4_ + auVar19._0_4_ * fVar186;
            auVar148._4_4_ = auVar165._4_4_ + auVar19._4_4_ * fVar204;
            auVar148._8_4_ = auVar165._8_4_ + auVar19._8_4_ * fVar205;
            auVar148._12_4_ = auVar165._12_4_ + auVar19._12_4_ * fVar206;
            auVar148._16_4_ = auVar165._0_4_ + auVar19._16_4_ * fVar207;
            auVar148._20_4_ = auVar165._4_4_ + auVar19._20_4_ * fVar229;
            auVar148._24_4_ = auVar165._8_4_ + auVar19._24_4_ * fVar230;
            auVar148._28_4_ = auVar165._12_4_ + auVar19._28_4_;
            auVar108 = vsubps_avx(auVar228,auVar181);
            auVar182._0_4_ = auVar216._0_4_ + auVar108._0_4_ * fVar186;
            auVar182._4_4_ = auVar216._4_4_ + auVar108._4_4_ * fVar204;
            auVar182._8_4_ = auVar216._8_4_ + auVar108._8_4_ * fVar205;
            auVar182._12_4_ = auVar216._12_4_ + auVar108._12_4_ * fVar206;
            auVar182._16_4_ = auVar216._0_4_ + auVar108._16_4_ * fVar207;
            auVar182._20_4_ = auVar216._4_4_ + auVar108._20_4_ * fVar229;
            auVar182._24_4_ = auVar216._8_4_ + auVar108._24_4_ * fVar230;
            auVar182._28_4_ = auVar216._12_4_ + auVar108._28_4_;
            auVar83 = vsubps_avx(auVar94,auVar241);
            auVar112._0_4_ = auVar241._0_4_ + auVar83._0_4_ * fVar186;
            auVar112._4_4_ = auVar241._4_4_ + auVar83._4_4_ * fVar204;
            auVar112._8_4_ = auVar241._8_4_ + auVar83._8_4_ * fVar205;
            auVar112._12_4_ = auVar241._12_4_ + auVar83._12_4_ * fVar206;
            auVar112._16_4_ = auVar241._0_4_ + auVar83._0_4_ * fVar207;
            auVar112._20_4_ = auVar241._4_4_ + auVar83._4_4_ * fVar229;
            auVar112._24_4_ = auVar241._8_4_ + auVar83._8_4_ * fVar230;
            auVar112._28_4_ = auVar241._12_4_ + auVar83._12_4_;
            auVar108 = vsubps_avx(auVar182,auVar148);
            auVar149._0_4_ = auVar148._0_4_ + fVar186 * auVar108._0_4_;
            auVar149._4_4_ = auVar148._4_4_ + fVar204 * auVar108._4_4_;
            auVar149._8_4_ = auVar148._8_4_ + fVar205 * auVar108._8_4_;
            auVar149._12_4_ = auVar148._12_4_ + fVar206 * auVar108._12_4_;
            auVar149._16_4_ = auVar148._16_4_ + fVar207 * auVar108._16_4_;
            auVar149._20_4_ = auVar148._20_4_ + fVar229 * auVar108._20_4_;
            auVar149._24_4_ = auVar148._24_4_ + fVar230 * auVar108._24_4_;
            auVar149._28_4_ = auVar148._28_4_ + auVar108._28_4_;
            auVar108 = vsubps_avx(auVar112,auVar182);
            auVar113._0_4_ = auVar182._0_4_ + fVar186 * auVar108._0_4_;
            auVar113._4_4_ = auVar182._4_4_ + fVar204 * auVar108._4_4_;
            auVar113._8_4_ = auVar182._8_4_ + fVar205 * auVar108._8_4_;
            auVar113._12_4_ = auVar182._12_4_ + fVar206 * auVar108._12_4_;
            auVar113._16_4_ = auVar182._16_4_ + fVar207 * auVar108._16_4_;
            auVar113._20_4_ = auVar182._20_4_ + fVar229 * auVar108._20_4_;
            auVar113._24_4_ = auVar182._24_4_ + fVar230 * auVar108._24_4_;
            auVar113._28_4_ = auVar182._28_4_ + auVar108._28_4_;
            auVar108 = vsubps_avx(auVar113,auVar149);
            auVar260._0_4_ = auVar149._0_4_ + fVar186 * auVar108._0_4_;
            auVar260._4_4_ = auVar149._4_4_ + fVar204 * auVar108._4_4_;
            auVar260._8_4_ = auVar149._8_4_ + fVar205 * auVar108._8_4_;
            auVar260._12_4_ = auVar149._12_4_ + fVar206 * auVar108._12_4_;
            auVar263._16_4_ = auVar149._16_4_ + fVar207 * auVar108._16_4_;
            auVar263._0_16_ = auVar260;
            auVar263._20_4_ = auVar149._20_4_ + fVar229 * auVar108._20_4_;
            auVar263._24_4_ = auVar149._24_4_ + fVar230 * auVar108._24_4_;
            auVar263._28_4_ = auVar149._28_4_ + auVar182._28_4_;
            auVar264 = auVar263._16_16_;
            auVar129 = vshufps_avx(ZEXT416((uint)(fVar184 * 0.33333334)),
                                   ZEXT416((uint)(fVar184 * 0.33333334)),0);
            auVar242._0_4_ = auVar260._0_4_ + auVar129._0_4_ * auVar108._0_4_ * 3.0;
            auVar242._4_4_ = auVar260._4_4_ + auVar129._4_4_ * auVar108._4_4_ * 3.0;
            auVar242._8_4_ = auVar260._8_4_ + auVar129._8_4_ * auVar108._8_4_ * 3.0;
            auVar242._12_4_ = auVar260._12_4_ + auVar129._12_4_ * auVar108._12_4_ * 3.0;
            auVar178 = vshufpd_avx(auVar260,auVar260,3);
            auVar140 = vshufpd_avx(auVar264,auVar264,3);
            auVar83 = vsubps_avx(auVar178,auVar260);
            auVar84 = vsubps_avx(auVar140,auVar264);
            auVar95._0_4_ = auVar83._0_4_ + auVar84._0_4_;
            auVar95._4_4_ = auVar83._4_4_ + auVar84._4_4_;
            auVar95._8_4_ = auVar83._8_4_ + auVar84._8_4_;
            auVar95._12_4_ = auVar83._12_4_ + auVar84._12_4_;
            auVar83 = vmovshdup_avx(auVar260);
            auVar84 = vmovshdup_avx(auVar242);
            auVar168 = vshufps_avx(auVar95,auVar95,0);
            auVar130 = vshufps_avx(auVar95,auVar95,0x55);
            fVar186 = auVar130._0_4_;
            fVar204 = auVar130._4_4_;
            fVar205 = auVar130._8_4_;
            fVar206 = auVar130._12_4_;
            fVar207 = auVar168._0_4_;
            fVar229 = auVar168._4_4_;
            fVar230 = auVar168._8_4_;
            fVar231 = auVar168._12_4_;
            auVar96._0_4_ = fVar207 * auVar260._0_4_ + auVar83._0_4_ * fVar186;
            auVar96._4_4_ = fVar229 * auVar260._4_4_ + auVar83._4_4_ * fVar204;
            auVar96._8_4_ = fVar230 * auVar260._8_4_ + auVar83._8_4_ * fVar205;
            auVar96._12_4_ = fVar231 * auVar260._12_4_ + auVar83._12_4_ * fVar206;
            auVar166._0_4_ = fVar207 * auVar242._0_4_ + auVar84._0_4_ * fVar186;
            auVar166._4_4_ = fVar229 * auVar242._4_4_ + auVar84._4_4_ * fVar204;
            auVar166._8_4_ = fVar230 * auVar242._8_4_ + auVar84._8_4_ * fVar205;
            auVar166._12_4_ = fVar231 * auVar242._12_4_ + auVar84._12_4_ * fVar206;
            auVar84 = vshufps_avx(auVar96,auVar96,0xe8);
            auVar168 = vshufps_avx(auVar166,auVar166,0xe8);
            auVar83 = vcmpps_avx(auVar84,auVar168,1);
            uVar70 = vextractps_avx(auVar83,0);
            auVar130 = auVar166;
            if ((uVar70 & 1) == 0) {
              auVar130 = auVar96;
            }
            auVar128._0_4_ = auVar129._0_4_ * auVar108._16_4_ * 3.0;
            auVar128._4_4_ = auVar129._4_4_ * auVar108._20_4_ * 3.0;
            auVar128._8_4_ = auVar129._8_4_ * auVar108._24_4_ * 3.0;
            auVar128._12_4_ = auVar129._12_4_ * 0.0;
            auVar73 = vsubps_avx(auVar264,auVar128);
            auVar129 = vmovshdup_avx(auVar73);
            auVar264 = vmovshdup_avx(auVar264);
            fVar331 = auVar73._0_4_;
            fVar332 = auVar73._4_4_;
            auVar217._0_4_ = fVar331 * fVar207 + auVar129._0_4_ * fVar186;
            auVar217._4_4_ = fVar332 * fVar229 + auVar129._4_4_ * fVar204;
            auVar217._8_4_ = auVar73._8_4_ * fVar230 + auVar129._8_4_ * fVar205;
            auVar217._12_4_ = auVar73._12_4_ * fVar231 + auVar129._12_4_ * fVar206;
            auVar243._0_4_ = fVar207 * auVar263._16_4_ + auVar264._0_4_ * fVar186;
            auVar243._4_4_ = fVar229 * auVar263._20_4_ + auVar264._4_4_ * fVar204;
            auVar243._8_4_ = fVar230 * auVar263._24_4_ + auVar264._8_4_ * fVar205;
            auVar243._12_4_ = fVar231 * auVar263._28_4_ + auVar264._12_4_ * fVar206;
            auVar264 = vshufps_avx(auVar217,auVar217,0xe8);
            auVar16 = vshufps_avx(auVar243,auVar243,0xe8);
            auVar129 = vcmpps_avx(auVar264,auVar16,1);
            uVar70 = vextractps_avx(auVar129,0);
            auVar74 = auVar243;
            if ((uVar70 & 1) == 0) {
              auVar74 = auVar217;
            }
            auVar130 = vmaxss_avx(auVar74,auVar130);
            auVar84 = vminps_avx(auVar84,auVar168);
            auVar168 = vminps_avx(auVar264,auVar16);
            auVar168 = vminps_avx(auVar84,auVar168);
            auVar83 = vshufps_avx(auVar83,auVar83,0x55);
            auVar83 = vblendps_avx(auVar83,auVar129,2);
            auVar129 = vpslld_avx(auVar83,0x1f);
            auVar83 = vshufpd_avx(auVar166,auVar166,1);
            auVar83 = vinsertps_avx(auVar83,auVar243,0x9c);
            auVar84 = vshufpd_avx(auVar96,auVar96,1);
            auVar84 = vinsertps_avx(auVar84,auVar217,0x9c);
            auVar83 = vblendvps_avx(auVar84,auVar83,auVar129);
            auVar84 = vmovshdup_avx(auVar83);
            auVar83 = vmaxss_avx(auVar84,auVar83);
            fVar205 = auVar168._0_4_;
            auVar84 = vmovshdup_avx(auVar168);
            fVar204 = auVar83._0_4_;
            fVar206 = auVar84._0_4_;
            fVar186 = auVar130._0_4_;
            if ((fVar205 < 0.0001) && (-0.0001 < fVar204)) break;
            if ((fVar206 < 0.0001 && -0.0001 < fVar186) || (fVar205 < 0.0001 && -0.0001 < fVar186))
            break;
            auVar129 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar83,1);
            auVar84 = vcmpps_avx(auVar84,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar84 = vandps_avx(auVar84,auVar129);
          } while ((auVar84 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar129 = vcmpps_avx(auVar168,_DAT_01f7aa10,1);
          auVar84 = vcmpss_avx(auVar130,ZEXT416(0),1);
          auVar167._8_4_ = 0x3f800000;
          auVar167._0_8_ = 0x3f8000003f800000;
          auVar167._12_4_ = 0x3f800000;
          auVar218._8_4_ = 0xbf800000;
          auVar218._0_8_ = 0xbf800000bf800000;
          auVar218._12_4_ = 0xbf800000;
          auVar84 = vblendvps_avx(auVar167,auVar218,auVar84);
          auVar129 = vblendvps_avx(auVar167,auVar218,auVar129);
          auVar168 = vcmpss_avx(auVar129,auVar84,4);
          auVar168 = vpshufd_avx(ZEXT416(auVar168._0_4_ & 1),0x50);
          auVar168 = vpslld_avx(auVar168,0x1f);
          auVar168 = vpsrad_avx(auVar168,0x1f);
          auVar168 = vpandn_avx(auVar168,_DAT_01fafeb0);
          auVar130 = vmovshdup_avx(auVar129);
          fVar207 = auVar130._0_4_;
          if ((auVar129._0_4_ != fVar207) || (NAN(auVar129._0_4_) || NAN(fVar207))) {
            if ((fVar206 != fVar205) || (NAN(fVar206) || NAN(fVar205))) {
              fVar205 = -fVar205 / (fVar206 - fVar205);
              auVar129 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar205) * 0.0 + fVar205)));
            }
            else {
              auVar129 = ZEXT816(0x3f80000000000000);
              if ((fVar205 != 0.0) || (NAN(fVar205))) {
                auVar129 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar264 = vcmpps_avx(auVar168,auVar129,1);
            auVar130 = vblendps_avx(auVar168,auVar129,2);
            auVar129 = vblendps_avx(auVar129,auVar168,2);
            auVar168 = vblendvps_avx(auVar129,auVar130,auVar264);
          }
          auVar83 = vcmpss_avx(auVar83,ZEXT416(0),1);
          auVar169._8_4_ = 0x3f800000;
          auVar169._0_8_ = 0x3f8000003f800000;
          auVar169._12_4_ = 0x3f800000;
          auVar219._8_4_ = 0xbf800000;
          auVar219._0_8_ = 0xbf800000bf800000;
          auVar219._12_4_ = 0xbf800000;
          auVar83 = vblendvps_avx(auVar169,auVar219,auVar83);
          fVar205 = auVar83._0_4_;
          if ((auVar84._0_4_ != fVar205) || (NAN(auVar84._0_4_) || NAN(fVar205))) {
            if ((fVar204 != fVar186) || (NAN(fVar204) || NAN(fVar186))) {
              fVar186 = -fVar186 / (fVar204 - fVar186);
              auVar83 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar186) * 0.0 + fVar186)));
            }
            else {
              auVar83 = ZEXT816(0x3f80000000000000);
              if ((fVar186 != 0.0) || (NAN(fVar186))) {
                auVar83 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar129 = vcmpps_avx(auVar168,auVar83,1);
            auVar84 = vblendps_avx(auVar168,auVar83,2);
            auVar83 = vblendps_avx(auVar83,auVar168,2);
            auVar168 = vblendvps_avx(auVar83,auVar84,auVar129);
          }
          if ((fVar207 != fVar205) || (NAN(fVar207) || NAN(fVar205))) {
            auVar97._8_4_ = 0x3f800000;
            auVar97._0_8_ = 0x3f8000003f800000;
            auVar97._12_4_ = 0x3f800000;
            auVar83 = vcmpps_avx(auVar168,auVar97,1);
            auVar84 = vinsertps_avx(auVar168,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar170._4_12_ = auVar168._4_12_;
            auVar170._0_4_ = 0x3f800000;
            auVar168 = vblendvps_avx(auVar170,auVar84,auVar83);
          }
          auVar83 = vcmpps_avx(auVar168,_DAT_01f7b6f0,1);
          auVar54._12_4_ = 0;
          auVar54._0_12_ = auVar168._4_12_;
          auVar84 = vinsertps_avx(auVar168,ZEXT416(0x3f800000),0x10);
          auVar83 = vblendvps_avx(auVar84,auVar54 << 0x20,auVar83);
          auVar84 = vmovshdup_avx(auVar83);
        } while (auVar84._0_4_ < auVar83._0_4_);
        auVar98._0_4_ = auVar83._0_4_ + -0.1;
        auVar98._4_4_ = auVar83._4_4_ + 0.1;
        auVar98._8_4_ = auVar83._8_4_ + 0.0;
        auVar98._12_4_ = auVar83._12_4_ + 0.0;
        auVar129 = vshufpd_avx(auVar242,auVar242,3);
        auVar261._8_8_ = 0x3f80000000000000;
        auVar261._0_8_ = 0x3f80000000000000;
        auVar83 = vcmpps_avx(auVar98,auVar261,1);
        auVar53._12_4_ = 0;
        auVar53._0_12_ = auVar98._4_12_;
        auVar84 = vinsertps_avx(auVar98,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar83 = vblendvps_avx(auVar84,auVar53 << 0x20,auVar83);
        auVar84 = vshufpd_avx(auVar73,auVar73,3);
        auVar168 = vshufps_avx(auVar83,auVar83,0x50);
        auVar262._8_4_ = 0x3f800000;
        auVar262._0_8_ = 0x3f8000003f800000;
        auVar262._12_4_ = 0x3f800000;
        auVar130 = vsubps_avx(auVar262,auVar168);
        local_468 = auVar178._0_4_;
        fStack_464 = auVar178._4_4_;
        fStack_460 = auVar178._8_4_;
        fStack_45c = auVar178._12_4_;
        fVar186 = auVar168._0_4_;
        fVar204 = auVar168._4_4_;
        fVar205 = auVar168._8_4_;
        fVar206 = auVar168._12_4_;
        local_588 = auVar140._0_4_;
        fStack_584 = auVar140._4_4_;
        fStack_580 = auVar140._8_4_;
        fStack_57c = auVar140._12_4_;
        fVar207 = auVar130._0_4_;
        fVar229 = auVar130._4_4_;
        fVar230 = auVar130._8_4_;
        fVar231 = auVar130._12_4_;
        auVar99._0_4_ = fVar186 * local_468 + fVar207 * auVar260._0_4_;
        auVar99._4_4_ = fVar204 * fStack_464 + fVar229 * auVar260._4_4_;
        auVar99._8_4_ = fVar205 * fStack_460 + fVar230 * auVar260._0_4_;
        auVar99._12_4_ = fVar206 * fStack_45c + fVar231 * auVar260._4_4_;
        auVar171._0_4_ = fVar186 * auVar129._0_4_ + fVar207 * auVar242._0_4_;
        auVar171._4_4_ = fVar204 * auVar129._4_4_ + fVar229 * auVar242._4_4_;
        auVar171._8_4_ = fVar205 * auVar129._8_4_ + fVar230 * auVar242._0_4_;
        auVar171._12_4_ = fVar206 * auVar129._12_4_ + fVar231 * auVar242._4_4_;
        auVar244._0_4_ = fVar186 * auVar84._0_4_ + fVar207 * fVar331;
        auVar244._4_4_ = fVar204 * auVar84._4_4_ + fVar229 * fVar332;
        auVar244._8_4_ = fVar205 * auVar84._8_4_ + fVar230 * fVar331;
        auVar244._12_4_ = fVar206 * auVar84._12_4_ + fVar231 * fVar332;
        auVar273._0_4_ = fVar186 * local_588 + fVar207 * auVar263._16_4_;
        auVar273._4_4_ = fVar204 * fStack_584 + fVar229 * auVar263._20_4_;
        auVar273._8_4_ = fVar205 * fStack_580 + fVar230 * auVar263._16_4_;
        auVar273._12_4_ = fVar206 * fStack_57c + fVar231 * auVar263._20_4_;
        auVar140 = vsubps_avx(auVar262,auVar83);
        auVar84 = vmovshdup_avx(auVar93);
        auVar178 = vmovsldup_avx(auVar93);
        auVar93._0_4_ = auVar178._0_4_ * auVar140._0_4_ + auVar83._0_4_ * auVar84._0_4_;
        auVar93._4_4_ = auVar178._4_4_ * auVar140._4_4_ + auVar83._4_4_ * auVar84._4_4_;
        auVar93._8_4_ = auVar178._8_4_ * auVar140._8_4_ + auVar83._8_4_ * auVar84._8_4_;
        auVar93._12_4_ = auVar178._12_4_ * auVar140._12_4_ + auVar83._12_4_ * auVar84._12_4_;
        auVar73 = vmovshdup_avx(auVar93);
        auVar83 = vsubps_avx(auVar171,auVar99);
        auVar201._0_4_ = auVar83._0_4_ * 3.0;
        auVar201._4_4_ = auVar83._4_4_ * 3.0;
        auVar201._8_4_ = auVar83._8_4_ * 3.0;
        auVar201._12_4_ = auVar83._12_4_ * 3.0;
        auVar83 = vsubps_avx(auVar244,auVar171);
        auVar285._0_4_ = auVar83._0_4_ * 3.0;
        auVar285._4_4_ = auVar83._4_4_ * 3.0;
        auVar285._8_4_ = auVar83._8_4_ * 3.0;
        auVar285._12_4_ = auVar83._12_4_ * 3.0;
        auVar83 = vsubps_avx(auVar273,auVar244);
        auVar293._0_4_ = auVar83._0_4_ * 3.0;
        auVar293._4_4_ = auVar83._4_4_ * 3.0;
        auVar293._8_4_ = auVar83._8_4_ * 3.0;
        auVar293._12_4_ = auVar83._12_4_ * 3.0;
        auVar84 = vminps_avx(auVar285,auVar293);
        auVar83 = vmaxps_avx(auVar285,auVar293);
        auVar84 = vminps_avx(auVar201,auVar84);
        auVar83 = vmaxps_avx(auVar201,auVar83);
        auVar178 = vshufpd_avx(auVar84,auVar84,3);
        auVar140 = vshufpd_avx(auVar83,auVar83,3);
        auVar84 = vminps_avx(auVar84,auVar178);
        auVar83 = vmaxps_avx(auVar83,auVar140);
        auVar178 = vshufps_avx(ZEXT416((uint)(1.0 / fVar184)),ZEXT416((uint)(1.0 / fVar184)),0);
        auVar286._0_4_ = auVar84._0_4_ * auVar178._0_4_;
        auVar286._4_4_ = auVar84._4_4_ * auVar178._4_4_;
        auVar286._8_4_ = auVar84._8_4_ * auVar178._8_4_;
        auVar286._12_4_ = auVar84._12_4_ * auVar178._12_4_;
        auVar294._0_4_ = auVar178._0_4_ * auVar83._0_4_;
        auVar294._4_4_ = auVar178._4_4_ * auVar83._4_4_;
        auVar294._8_4_ = auVar178._8_4_ * auVar83._8_4_;
        auVar294._12_4_ = auVar178._12_4_ * auVar83._12_4_;
        auVar130 = ZEXT416((uint)(1.0 / (auVar73._0_4_ - auVar93._0_4_)));
        auVar83 = vshufpd_avx(auVar99,auVar99,3);
        auVar84 = vshufpd_avx(auVar171,auVar171,3);
        auVar178 = vshufpd_avx(auVar244,auVar244,3);
        auVar140 = vshufpd_avx(auVar273,auVar273,3);
        auVar83 = vsubps_avx(auVar83,auVar99);
        auVar129 = vsubps_avx(auVar84,auVar171);
        auVar168 = vsubps_avx(auVar178,auVar244);
        auVar140 = vsubps_avx(auVar140,auVar273);
        auVar84 = vminps_avx(auVar83,auVar129);
        auVar83 = vmaxps_avx(auVar83,auVar129);
        auVar178 = vminps_avx(auVar168,auVar140);
        auVar178 = vminps_avx(auVar84,auVar178);
        auVar84 = vmaxps_avx(auVar168,auVar140);
        auVar83 = vmaxps_avx(auVar83,auVar84);
        auVar84 = vshufps_avx(auVar130,auVar130,0);
        auVar342._0_4_ = auVar84._0_4_ * auVar178._0_4_;
        auVar342._4_4_ = auVar84._4_4_ * auVar178._4_4_;
        auVar342._8_4_ = auVar84._8_4_ * auVar178._8_4_;
        auVar342._12_4_ = auVar84._12_4_ * auVar178._12_4_;
        auVar351._0_4_ = auVar84._0_4_ * auVar83._0_4_;
        auVar351._4_4_ = auVar84._4_4_ * auVar83._4_4_;
        auVar351._8_4_ = auVar84._8_4_ * auVar83._8_4_;
        auVar351._12_4_ = auVar84._12_4_ * auVar83._12_4_;
        auVar83 = vmovsldup_avx(auVar93);
        auVar309._4_12_ = auVar83._4_12_;
        auVar309._0_4_ = fVar185;
        auVar318._4_12_ = auVar93._4_12_;
        auVar318._0_4_ = fVar183;
        auVar202._0_4_ = (fVar185 + fVar183) * 0.5;
        auVar202._4_4_ = (auVar83._4_4_ + auVar93._4_4_) * 0.5;
        auVar202._8_4_ = (auVar83._8_4_ + auVar93._8_4_) * 0.5;
        auVar202._12_4_ = (auVar83._12_4_ + auVar93._12_4_) * 0.5;
        auVar83 = vshufps_avx(auVar202,auVar202,0);
        fVar186 = auVar83._0_4_;
        fVar204 = auVar83._4_4_;
        fVar205 = auVar83._8_4_;
        fVar206 = auVar83._12_4_;
        local_5b8 = auVar14._0_4_;
        fStack_5b4 = auVar14._4_4_;
        fStack_5b0 = auVar14._8_4_;
        fStack_5ac = auVar14._12_4_;
        auVar131._0_4_ = fVar186 * (float)local_238._0_4_ + local_5b8;
        auVar131._4_4_ = fVar204 * (float)local_238._4_4_ + fStack_5b4;
        auVar131._8_4_ = fVar205 * fStack_230 + fStack_5b0;
        auVar131._12_4_ = fVar206 * fStack_22c + fStack_5ac;
        local_558 = auVar15._0_4_;
        fStack_554 = auVar15._4_4_;
        fStack_550 = auVar15._8_4_;
        fStack_54c = auVar15._12_4_;
        auVar172._0_4_ = fVar186 * (float)local_248._0_4_ + local_558;
        auVar172._4_4_ = fVar204 * (float)local_248._4_4_ + fStack_554;
        auVar172._8_4_ = fVar205 * fStack_240 + fStack_550;
        auVar172._12_4_ = fVar206 * fStack_23c + fStack_54c;
        local_568._0_4_ = auVar122._0_4_;
        local_568._4_4_ = auVar122._4_4_;
        fStack_560 = auVar122._8_4_;
        fStack_55c = auVar122._12_4_;
        auVar245._0_4_ = fVar186 * (float)local_258._0_4_ + (float)local_568._0_4_;
        auVar245._4_4_ = fVar204 * (float)local_258._4_4_ + (float)local_568._4_4_;
        auVar245._8_4_ = fVar205 * fStack_250 + fStack_560;
        auVar245._12_4_ = fVar206 * fStack_24c + fStack_55c;
        auVar83 = vsubps_avx(auVar172,auVar131);
        auVar132._0_4_ = auVar131._0_4_ + fVar186 * auVar83._0_4_;
        auVar132._4_4_ = auVar131._4_4_ + fVar204 * auVar83._4_4_;
        auVar132._8_4_ = auVar131._8_4_ + fVar205 * auVar83._8_4_;
        auVar132._12_4_ = auVar131._12_4_ + fVar206 * auVar83._12_4_;
        auVar83 = vsubps_avx(auVar245,auVar172);
        auVar173._0_4_ = auVar172._0_4_ + fVar186 * auVar83._0_4_;
        auVar173._4_4_ = auVar172._4_4_ + fVar204 * auVar83._4_4_;
        auVar173._8_4_ = auVar172._8_4_ + fVar205 * auVar83._8_4_;
        auVar173._12_4_ = auVar172._12_4_ + fVar206 * auVar83._12_4_;
        auVar83 = vsubps_avx(auVar173,auVar132);
        fVar186 = auVar132._0_4_ + fVar186 * auVar83._0_4_;
        fVar204 = auVar132._4_4_ + fVar204 * auVar83._4_4_;
        auVar100._0_8_ = CONCAT44(fVar204,fVar186);
        auVar100._8_4_ = auVar132._8_4_ + fVar205 * auVar83._8_4_;
        auVar100._12_4_ = auVar132._12_4_ + fVar206 * auVar83._12_4_;
        fVar205 = auVar83._0_4_ * 3.0;
        fVar206 = auVar83._4_4_ * 3.0;
        auVar133._0_8_ = CONCAT44(fVar206,fVar205);
        auVar133._8_4_ = auVar83._8_4_ * 3.0;
        auVar133._12_4_ = auVar83._12_4_ * 3.0;
        auVar174._8_8_ = auVar100._0_8_;
        auVar174._0_8_ = auVar100._0_8_;
        auVar83 = vshufpd_avx(auVar100,auVar100,3);
        auVar84 = vshufps_avx(auVar202,auVar202,0x55);
        auVar168 = vsubps_avx(auVar83,auVar174);
        auVar330._0_4_ = auVar168._0_4_ * auVar84._0_4_ + fVar186;
        auVar330._4_4_ = auVar168._4_4_ * auVar84._4_4_ + fVar204;
        auVar330._8_4_ = auVar168._8_4_ * auVar84._8_4_ + fVar186;
        auVar330._12_4_ = auVar168._12_4_ * auVar84._12_4_ + fVar204;
        auVar175._8_8_ = auVar133._0_8_;
        auVar175._0_8_ = auVar133._0_8_;
        auVar83 = vshufpd_avx(auVar133,auVar133,1);
        auVar83 = vsubps_avx(auVar83,auVar175);
        auVar134._0_4_ = auVar83._0_4_ * auVar84._0_4_ + fVar205;
        auVar134._4_4_ = auVar83._4_4_ * auVar84._4_4_ + fVar206;
        auVar134._8_4_ = auVar83._8_4_ * auVar84._8_4_ + fVar205;
        auVar134._12_4_ = auVar83._12_4_ * auVar84._12_4_ + fVar206;
        auVar84 = vmovshdup_avx(auVar134);
        auVar246._0_8_ = auVar84._0_8_ ^ 0x8000000080000000;
        auVar246._8_4_ = auVar84._8_4_ ^ 0x80000000;
        auVar246._12_4_ = auVar84._12_4_ ^ 0x80000000;
        auVar178 = vmovshdup_avx(auVar168);
        auVar83 = vunpcklps_avx(auVar178,auVar246);
        auVar140 = vshufps_avx(auVar83,auVar246,4);
        auVar101._0_8_ = auVar168._0_8_ ^ 0x8000000080000000;
        auVar101._8_4_ = -auVar168._8_4_;
        auVar101._12_4_ = -auVar168._12_4_;
        auVar83 = vmovlhps_avx(auVar101,auVar134);
        auVar129 = vshufps_avx(auVar83,auVar134,8);
        auVar83 = ZEXT416((uint)(auVar134._0_4_ * auVar178._0_4_ - auVar168._0_4_ * auVar84._0_4_));
        auVar84 = vshufps_avx(auVar83,auVar83,0);
        auVar83 = vdivps_avx(auVar140,auVar84);
        auVar84 = vdivps_avx(auVar129,auVar84);
        auVar129 = vinsertps_avx(auVar286,auVar342,0x1c);
        auVar168 = vinsertps_avx(auVar294,auVar351,0x1c);
        auVar130 = vinsertps_avx(auVar342,auVar286,0x4c);
        auVar264 = vinsertps_avx(auVar351,auVar294,0x4c);
        auVar178 = vmovsldup_avx(auVar83);
        auVar295._0_4_ = auVar129._0_4_ * auVar178._0_4_;
        auVar295._4_4_ = auVar129._4_4_ * auVar178._4_4_;
        auVar295._8_4_ = auVar129._8_4_ * auVar178._8_4_;
        auVar295._12_4_ = auVar129._12_4_ * auVar178._12_4_;
        auVar135._0_4_ = auVar178._0_4_ * auVar168._0_4_;
        auVar135._4_4_ = auVar178._4_4_ * auVar168._4_4_;
        auVar135._8_4_ = auVar178._8_4_ * auVar168._8_4_;
        auVar135._12_4_ = auVar178._12_4_ * auVar168._12_4_;
        auVar140 = vminps_avx(auVar295,auVar135);
        auVar178 = vmaxps_avx(auVar135,auVar295);
        auVar16 = vmovsldup_avx(auVar84);
        auVar352._0_4_ = auVar16._0_4_ * auVar130._0_4_;
        auVar352._4_4_ = auVar16._4_4_ * auVar130._4_4_;
        auVar352._8_4_ = auVar16._8_4_ * auVar130._8_4_;
        auVar352._12_4_ = auVar16._12_4_ * auVar130._12_4_;
        auVar296._0_4_ = auVar16._0_4_ * auVar264._0_4_;
        auVar296._4_4_ = auVar16._4_4_ * auVar264._4_4_;
        auVar296._8_4_ = auVar16._8_4_ * auVar264._8_4_;
        auVar296._12_4_ = auVar16._12_4_ * auVar264._12_4_;
        auVar16 = vminps_avx(auVar352,auVar296);
        auVar220._0_4_ = auVar140._0_4_ + auVar16._0_4_;
        auVar220._4_4_ = auVar140._4_4_ + auVar16._4_4_;
        auVar220._8_4_ = auVar140._8_4_ + auVar16._8_4_;
        auVar220._12_4_ = auVar140._12_4_ + auVar16._12_4_;
        auVar140 = vmaxps_avx(auVar296,auVar352);
        auVar16 = vsubps_avx(auVar309,auVar202);
        auVar74 = vsubps_avx(auVar318,auVar202);
        auVar136._0_4_ = auVar140._0_4_ + auVar178._0_4_;
        auVar136._4_4_ = auVar140._4_4_ + auVar178._4_4_;
        auVar136._8_4_ = auVar140._8_4_ + auVar178._8_4_;
        auVar136._12_4_ = auVar140._12_4_ + auVar178._12_4_;
        auVar319._8_8_ = 0x3f800000;
        auVar319._0_8_ = 0x3f800000;
        auVar178 = vsubps_avx(auVar319,auVar136);
        auVar140 = vsubps_avx(auVar319,auVar220);
        fVar230 = auVar16._0_4_;
        auVar320._0_4_ = fVar230 * auVar178._0_4_;
        fVar231 = auVar16._4_4_;
        auVar320._4_4_ = fVar231 * auVar178._4_4_;
        fVar331 = auVar16._8_4_;
        auVar320._8_4_ = fVar331 * auVar178._8_4_;
        fVar332 = auVar16._12_4_;
        auVar320._12_4_ = fVar332 * auVar178._12_4_;
        fVar205 = auVar74._0_4_;
        auVar137._0_4_ = fVar205 * auVar178._0_4_;
        fVar206 = auVar74._4_4_;
        auVar137._4_4_ = fVar206 * auVar178._4_4_;
        fVar207 = auVar74._8_4_;
        auVar137._8_4_ = fVar207 * auVar178._8_4_;
        fVar229 = auVar74._12_4_;
        auVar137._12_4_ = fVar229 * auVar178._12_4_;
        auVar343._0_4_ = fVar230 * auVar140._0_4_;
        auVar343._4_4_ = fVar231 * auVar140._4_4_;
        auVar343._8_4_ = fVar331 * auVar140._8_4_;
        auVar343._12_4_ = fVar332 * auVar140._12_4_;
        auVar221._0_4_ = fVar205 * auVar140._0_4_;
        auVar221._4_4_ = fVar206 * auVar140._4_4_;
        auVar221._8_4_ = fVar207 * auVar140._8_4_;
        auVar221._12_4_ = fVar229 * auVar140._12_4_;
        auVar178 = vminps_avx(auVar320,auVar343);
        auVar140 = vminps_avx(auVar137,auVar221);
        auVar16 = vminps_avx(auVar178,auVar140);
        auVar178 = vmaxps_avx(auVar343,auVar320);
        auVar140 = vmaxps_avx(auVar221,auVar137);
        auVar74 = vshufps_avx(auVar202,auVar202,0x54);
        auVar140 = vmaxps_avx(auVar140,auVar178);
        auVar75 = vshufps_avx(auVar330,auVar330,0);
        auVar114 = vshufps_avx(auVar330,auVar330,0x55);
        auVar178 = vhaddps_avx(auVar16,auVar16);
        auVar140 = vhaddps_avx(auVar140,auVar140);
        auVar222._0_4_ = auVar114._0_4_ * auVar84._0_4_ + auVar75._0_4_ * auVar83._0_4_;
        auVar222._4_4_ = auVar114._4_4_ * auVar84._4_4_ + auVar75._4_4_ * auVar83._4_4_;
        auVar222._8_4_ = auVar114._8_4_ * auVar84._8_4_ + auVar75._8_4_ * auVar83._8_4_;
        auVar222._12_4_ = auVar114._12_4_ * auVar84._12_4_ + auVar75._12_4_ * auVar83._12_4_;
        auVar16 = vsubps_avx(auVar74,auVar222);
        fVar186 = auVar16._0_4_ + auVar178._0_4_;
        fVar204 = auVar16._0_4_ + auVar140._0_4_;
        auVar178 = vmaxss_avx(ZEXT416((uint)fVar185),ZEXT416((uint)fVar186));
        auVar140 = vminss_avx(ZEXT416((uint)fVar204),ZEXT416((uint)fVar183));
      } while (auVar140._0_4_ < auVar178._0_4_);
      auVar178 = vmovshdup_avx(auVar83);
      auVar223._0_4_ = auVar129._0_4_ * auVar178._0_4_;
      auVar223._4_4_ = auVar129._4_4_ * auVar178._4_4_;
      auVar223._8_4_ = auVar129._8_4_ * auVar178._8_4_;
      auVar223._12_4_ = auVar129._12_4_ * auVar178._12_4_;
      auVar138._0_4_ = auVar178._0_4_ * auVar168._0_4_;
      auVar138._4_4_ = auVar178._4_4_ * auVar168._4_4_;
      auVar138._8_4_ = auVar178._8_4_ * auVar168._8_4_;
      auVar138._12_4_ = auVar178._12_4_ * auVar168._12_4_;
      auVar140 = vminps_avx(auVar223,auVar138);
      auVar178 = vmaxps_avx(auVar138,auVar223);
      auVar129 = vmovshdup_avx(auVar84);
      auVar102._0_4_ = auVar129._0_4_ * auVar130._0_4_;
      auVar102._4_4_ = auVar129._4_4_ * auVar130._4_4_;
      auVar102._8_4_ = auVar129._8_4_ * auVar130._8_4_;
      auVar102._12_4_ = auVar129._12_4_ * auVar130._12_4_;
      auVar224._0_4_ = auVar264._0_4_ * auVar129._0_4_;
      auVar224._4_4_ = auVar264._4_4_ * auVar129._4_4_;
      auVar224._8_4_ = auVar264._8_4_ * auVar129._8_4_;
      auVar224._12_4_ = auVar264._12_4_ * auVar129._12_4_;
      auVar129 = vminps_avx(auVar102,auVar224);
      auVar176._0_4_ = auVar140._0_4_ + auVar129._0_4_;
      auVar176._4_4_ = auVar140._4_4_ + auVar129._4_4_;
      auVar176._8_4_ = auVar140._8_4_ + auVar129._8_4_;
      auVar176._12_4_ = auVar140._12_4_ + auVar129._12_4_;
      auVar140 = vmaxps_avx(auVar224,auVar102);
      auVar103._0_4_ = auVar178._0_4_ + auVar140._0_4_;
      auVar103._4_4_ = auVar178._4_4_ + auVar140._4_4_;
      auVar103._8_4_ = auVar178._8_4_ + auVar140._8_4_;
      auVar103._12_4_ = auVar178._12_4_ + auVar140._12_4_;
      auVar178 = vsubps_avx(auVar261,auVar103);
      auVar140 = vsubps_avx(auVar261,auVar176);
      auVar177._0_4_ = fVar230 * auVar178._0_4_;
      auVar177._4_4_ = fVar231 * auVar178._4_4_;
      auVar177._8_4_ = fVar331 * auVar178._8_4_;
      auVar177._12_4_ = fVar332 * auVar178._12_4_;
      auVar225._0_4_ = fVar230 * auVar140._0_4_;
      auVar225._4_4_ = fVar231 * auVar140._4_4_;
      auVar225._8_4_ = fVar331 * auVar140._8_4_;
      auVar225._12_4_ = fVar332 * auVar140._12_4_;
      auVar104._0_4_ = fVar205 * auVar178._0_4_;
      auVar104._4_4_ = fVar206 * auVar178._4_4_;
      auVar104._8_4_ = fVar207 * auVar178._8_4_;
      auVar104._12_4_ = fVar229 * auVar178._12_4_;
      auVar139._0_4_ = fVar205 * auVar140._0_4_;
      auVar139._4_4_ = fVar206 * auVar140._4_4_;
      auVar139._8_4_ = fVar207 * auVar140._8_4_;
      auVar139._12_4_ = fVar229 * auVar140._12_4_;
      auVar178 = vminps_avx(auVar177,auVar225);
      auVar140 = vminps_avx(auVar104,auVar139);
      auVar178 = vminps_avx(auVar178,auVar140);
      auVar140 = vmaxps_avx(auVar225,auVar177);
      auVar129 = vmaxps_avx(auVar139,auVar104);
      auVar178 = vhaddps_avx(auVar178,auVar178);
      auVar140 = vmaxps_avx(auVar129,auVar140);
      auVar140 = vhaddps_avx(auVar140,auVar140);
      auVar129 = vmovshdup_avx(auVar16);
      auVar168 = ZEXT416((uint)(auVar129._0_4_ + auVar178._0_4_));
      auVar178 = vmaxss_avx(auVar93,auVar168);
      auVar129 = ZEXT416((uint)(auVar129._0_4_ + auVar140._0_4_));
      auVar140 = vminss_avx(auVar129,auVar73);
      auVar353._8_4_ = 0x7fffffff;
      auVar353._0_8_ = 0x7fffffff7fffffff;
      auVar353._12_4_ = 0x7fffffff;
    } while (auVar140._0_4_ < auVar178._0_4_);
    uVar70 = 0;
    if ((fVar185 < fVar186) && (fVar204 < fVar183)) {
      auVar178 = vcmpps_avx(auVar129,auVar73,1);
      auVar140 = vcmpps_avx(auVar93,auVar168,1);
      auVar178 = vandps_avx(auVar140,auVar178);
      uVar70 = auVar178._0_4_;
    }
    if ((3 < uVar69 || fVar184 < 0.001) || (uVar70 & 1) != 0) {
      lVar66 = 200;
      do {
        fVar184 = auVar16._0_4_;
        fVar183 = 1.0 - fVar184;
        auVar178 = ZEXT416((uint)(fVar183 * fVar183 * fVar183));
        auVar178 = vshufps_avx(auVar178,auVar178,0);
        auVar140 = ZEXT416((uint)(fVar184 * 3.0 * fVar183 * fVar183));
        auVar140 = vshufps_avx(auVar140,auVar140,0);
        auVar129 = ZEXT416((uint)(fVar183 * fVar184 * fVar184 * 3.0));
        auVar129 = vshufps_avx(auVar129,auVar129,0);
        auVar168 = ZEXT416((uint)(fVar184 * fVar184 * fVar184));
        auVar168 = vshufps_avx(auVar168,auVar168,0);
        fVar183 = local_5b8 * auVar178._0_4_ +
                  local_558 * auVar140._0_4_ +
                  (float)local_3c8._0_4_ * auVar168._0_4_ + (float)local_568._0_4_ * auVar129._0_4_;
        fVar184 = fStack_5b4 * auVar178._4_4_ +
                  fStack_554 * auVar140._4_4_ +
                  (float)local_3c8._4_4_ * auVar168._4_4_ + (float)local_568._4_4_ * auVar129._4_4_;
        auVar105._0_8_ = CONCAT44(fVar184,fVar183);
        auVar105._8_4_ =
             fStack_5b0 * auVar178._8_4_ +
             fStack_550 * auVar140._8_4_ + fStack_3c0 * auVar168._8_4_ + fStack_560 * auVar129._8_4_
        ;
        auVar105._12_4_ =
             fStack_5ac * auVar178._12_4_ +
             fStack_54c * auVar140._12_4_ +
             fStack_3bc * auVar168._12_4_ + fStack_55c * auVar129._12_4_;
        auVar141._8_8_ = auVar105._0_8_;
        auVar141._0_8_ = auVar105._0_8_;
        auVar140 = vshufpd_avx(auVar105,auVar105,1);
        auVar178 = vmovshdup_avx(auVar16);
        auVar140 = vsubps_avx(auVar140,auVar141);
        auVar106._0_4_ = auVar178._0_4_ * auVar140._0_4_ + fVar183;
        auVar106._4_4_ = auVar178._4_4_ * auVar140._4_4_ + fVar184;
        auVar106._8_4_ = auVar178._8_4_ * auVar140._8_4_ + fVar183;
        auVar106._12_4_ = auVar178._12_4_ * auVar140._12_4_ + fVar184;
        auVar178 = vshufps_avx(auVar106,auVar106,0);
        auVar140 = vshufps_avx(auVar106,auVar106,0x55);
        auVar142._0_4_ = auVar83._0_4_ * auVar178._0_4_ + auVar84._0_4_ * auVar140._0_4_;
        auVar142._4_4_ = auVar83._4_4_ * auVar178._4_4_ + auVar84._4_4_ * auVar140._4_4_;
        auVar142._8_4_ = auVar83._8_4_ * auVar178._8_4_ + auVar84._8_4_ * auVar140._8_4_;
        auVar142._12_4_ = auVar83._12_4_ * auVar178._12_4_ + auVar84._12_4_ * auVar140._12_4_;
        auVar16 = vsubps_avx(auVar16,auVar142);
        auVar178 = vandps_avx(auVar353,auVar106);
        auVar140 = vshufps_avx(auVar178,auVar178,0xf5);
        auVar178 = vmaxss_avx(auVar140,auVar178);
        if (auVar178._0_4_ < (float)local_3d8._0_4_) {
          fVar183 = auVar16._0_4_;
          if ((0.0 <= fVar183) && (fVar183 <= 1.0)) {
            auVar83 = vmovshdup_avx(auVar16);
            fVar184 = auVar83._0_4_;
            if ((0.0 <= fVar184) && (fVar184 <= 1.0)) {
              auVar83 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar264 = vinsertps_avx(auVar83,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                       0x28);
              auVar83 = vdpps_avx(auVar264,local_268,0x7f);
              auVar84 = vdpps_avx(auVar264,local_278,0x7f);
              auVar178 = vdpps_avx(auVar264,local_2a8,0x7f);
              auVar140 = vdpps_avx(auVar264,local_2b8,0x7f);
              auVar129 = vdpps_avx(auVar264,local_2c8,0x7f);
              auVar168 = vdpps_avx(auVar264,local_2d8,0x7f);
              fVar206 = 1.0 - fVar184;
              auVar130 = vdpps_avx(auVar264,local_288,0x7f);
              auVar264 = vdpps_avx(auVar264,local_298,0x7f);
              fVar207 = 1.0 - fVar183;
              fVar185 = auVar16._4_4_;
              fVar186 = auVar16._8_4_;
              fVar204 = auVar16._12_4_;
              fVar205 = fVar207 * fVar183 * fVar183 * 3.0;
              auVar247._0_4_ = fVar183 * fVar183 * fVar183;
              auVar247._4_4_ = fVar185 * fVar185 * fVar185;
              auVar247._8_4_ = fVar186 * fVar186 * fVar186;
              auVar247._12_4_ = fVar204 * fVar204 * fVar204;
              fVar185 = fVar183 * 3.0 * fVar207 * fVar207;
              fVar186 = fVar207 * fVar207 * fVar207;
              fVar183 = (fVar206 * auVar83._0_4_ + fVar184 * auVar178._0_4_) * fVar186 +
                        (fVar206 * auVar84._0_4_ + fVar184 * auVar140._0_4_) * fVar185 +
                        fVar205 * (fVar206 * auVar130._0_4_ + fVar184 * auVar129._0_4_) +
                        auVar247._0_4_ * (auVar168._0_4_ * fVar184 + fVar206 * auVar264._0_4_);
              if ((fVar151 <= fVar183) &&
                 (fVar184 = *(float *)(ray + k * 4 + 0x80), fVar183 <= fVar184)) {
                pGVar7 = (context->scene->geometries).items[uVar64].ptr;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar72 = false;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar72 = true, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_1a8 = vshufps_avx(auVar16,auVar16,0x55);
                  auVar287._8_4_ = 0x3f800000;
                  auVar287._0_8_ = 0x3f8000003f800000;
                  auVar287._12_4_ = 0x3f800000;
                  auVar83 = vsubps_avx(auVar287,local_1a8);
                  fVar204 = local_1a8._0_4_;
                  fVar206 = local_1a8._4_4_;
                  fVar229 = local_1a8._8_4_;
                  fVar230 = local_1a8._12_4_;
                  fVar231 = auVar83._0_4_;
                  fVar331 = auVar83._4_4_;
                  fVar332 = auVar83._8_4_;
                  fVar333 = auVar83._12_4_;
                  auVar297._0_4_ =
                       fVar204 * (float)local_418._0_4_ + fVar231 * (float)local_3e8._0_4_;
                  auVar297._4_4_ =
                       fVar206 * (float)local_418._4_4_ + fVar331 * (float)local_3e8._4_4_;
                  auVar297._8_4_ = fVar229 * fStack_410 + fVar332 * fStack_3e0;
                  auVar297._12_4_ = fVar230 * fStack_40c + fVar333 * fStack_3dc;
                  auVar310._0_4_ = fVar204 * fVar250 + fVar231 * fVar232;
                  auVar310._4_4_ = fVar206 * fVar315 + fVar331 * fVar150;
                  auVar310._8_4_ = fVar229 * fVar305 + fVar332 * fVar325;
                  auVar310._12_4_ = fVar230 * fVar314 + fVar333 * fVar313;
                  auVar321._0_4_ = fVar204 * fVar251 + fVar231 * (float)local_3f8._0_4_;
                  auVar321._4_4_ = fVar206 * fVar323 + fVar331 * (float)local_3f8._4_4_;
                  auVar321._8_4_ = fVar229 * fVar312 + fVar332 * fStack_3f0;
                  auVar321._12_4_ = fVar230 * fVar326 + fVar333 * fStack_3ec;
                  auVar288._0_4_ = fVar204 * local_428 + fVar231 * (float)local_408._0_4_;
                  auVar288._4_4_ = fVar206 * fStack_424 + fVar331 * (float)local_408._4_4_;
                  auVar288._8_4_ = fVar229 * fStack_420 + fVar332 * fStack_400;
                  auVar288._12_4_ = fVar230 * fStack_41c + fVar333 * fStack_3fc;
                  auVar140 = vsubps_avx(auVar310,auVar297);
                  auVar129 = vsubps_avx(auVar321,auVar310);
                  auVar168 = vsubps_avx(auVar288,auVar321);
                  local_1b8 = vshufps_avx(auVar16,auVar16,0);
                  fVar204 = local_1b8._0_4_;
                  fVar229 = local_1b8._4_4_;
                  fVar230 = local_1b8._8_4_;
                  fVar331 = local_1b8._12_4_;
                  auVar83 = vshufps_avx(ZEXT416((uint)fVar207),ZEXT416((uint)fVar207),0);
                  fVar206 = auVar83._0_4_;
                  fVar207 = auVar83._4_4_;
                  fVar231 = auVar83._8_4_;
                  fVar332 = auVar83._12_4_;
                  auVar83 = vshufps_avx(auVar247,auVar247,0);
                  auVar84 = vshufps_avx(ZEXT416((uint)fVar205),ZEXT416((uint)fVar205),0);
                  auVar178 = vshufps_avx(ZEXT416((uint)fVar185),ZEXT416((uint)fVar185),0);
                  auVar226._0_4_ =
                       ((auVar129._0_4_ * fVar206 + auVar168._0_4_ * fVar204) * fVar204 +
                       (auVar140._0_4_ * fVar206 + auVar129._0_4_ * fVar204) * fVar206) * 3.0;
                  auVar226._4_4_ =
                       ((auVar129._4_4_ * fVar207 + auVar168._4_4_ * fVar229) * fVar229 +
                       (auVar140._4_4_ * fVar207 + auVar129._4_4_ * fVar229) * fVar207) * 3.0;
                  auVar226._8_4_ =
                       ((auVar129._8_4_ * fVar231 + auVar168._8_4_ * fVar230) * fVar230 +
                       (auVar140._8_4_ * fVar231 + auVar129._8_4_ * fVar230) * fVar231) * 3.0;
                  auVar226._12_4_ =
                       ((auVar129._12_4_ * fVar332 + auVar168._12_4_ * fVar331) * fVar331 +
                       (auVar140._12_4_ * fVar332 + auVar129._12_4_ * fVar331) * fVar332) * 3.0;
                  auVar140 = vshufps_avx(ZEXT416((uint)fVar186),ZEXT416((uint)fVar186),0);
                  auVar143._0_4_ =
                       auVar140._0_4_ * (float)local_328._0_4_ +
                       auVar178._0_4_ * (float)local_338._0_4_ +
                       auVar83._0_4_ * (float)local_358._0_4_ +
                       auVar84._0_4_ * (float)local_348._0_4_;
                  auVar143._4_4_ =
                       auVar140._4_4_ * (float)local_328._4_4_ +
                       auVar178._4_4_ * (float)local_338._4_4_ +
                       auVar83._4_4_ * (float)local_358._4_4_ +
                       auVar84._4_4_ * (float)local_348._4_4_;
                  auVar143._8_4_ =
                       auVar140._8_4_ * fStack_320 +
                       auVar178._8_4_ * fStack_330 +
                       auVar83._8_4_ * fStack_350 + auVar84._8_4_ * fStack_340;
                  auVar143._12_4_ =
                       auVar140._12_4_ * fStack_31c +
                       auVar178._12_4_ * fStack_32c +
                       auVar83._12_4_ * fStack_34c + auVar84._12_4_ * fStack_33c;
                  auVar83 = vshufps_avx(auVar226,auVar226,0xc9);
                  auVar179._0_4_ = auVar143._0_4_ * auVar83._0_4_;
                  auVar179._4_4_ = auVar143._4_4_ * auVar83._4_4_;
                  auVar179._8_4_ = auVar143._8_4_ * auVar83._8_4_;
                  auVar179._12_4_ = auVar143._12_4_ * auVar83._12_4_;
                  auVar83 = vshufps_avx(auVar143,auVar143,0xc9);
                  auVar144._0_4_ = auVar226._0_4_ * auVar83._0_4_;
                  auVar144._4_4_ = auVar226._4_4_ * auVar83._4_4_;
                  auVar144._8_4_ = auVar226._8_4_ * auVar83._8_4_;
                  auVar144._12_4_ = auVar226._12_4_ * auVar83._12_4_;
                  auVar84 = vsubps_avx(auVar144,auVar179);
                  auVar83 = vshufps_avx(auVar84,auVar84,0x55);
                  local_1e8[0] = (RTCHitN)auVar83[0];
                  local_1e8[1] = (RTCHitN)auVar83[1];
                  local_1e8[2] = (RTCHitN)auVar83[2];
                  local_1e8[3] = (RTCHitN)auVar83[3];
                  local_1e8[4] = (RTCHitN)auVar83[4];
                  local_1e8[5] = (RTCHitN)auVar83[5];
                  local_1e8[6] = (RTCHitN)auVar83[6];
                  local_1e8[7] = (RTCHitN)auVar83[7];
                  local_1e8[8] = (RTCHitN)auVar83[8];
                  local_1e8[9] = (RTCHitN)auVar83[9];
                  local_1e8[10] = (RTCHitN)auVar83[10];
                  local_1e8[0xb] = (RTCHitN)auVar83[0xb];
                  local_1e8[0xc] = (RTCHitN)auVar83[0xc];
                  local_1e8[0xd] = (RTCHitN)auVar83[0xd];
                  local_1e8[0xe] = (RTCHitN)auVar83[0xe];
                  local_1e8[0xf] = (RTCHitN)auVar83[0xf];
                  local_1d8 = vshufps_avx(auVar84,auVar84,0xaa);
                  local_1c8 = vshufps_avx(auVar84,auVar84,0);
                  local_198 = local_318._0_8_;
                  uStack_190 = local_318._8_8_;
                  local_188 = local_308._0_8_;
                  uStack_180 = local_308._8_8_;
                  vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                  uStack_174 = context->user->instID[0];
                  local_178 = uStack_174;
                  uStack_170 = uStack_174;
                  uStack_16c = uStack_174;
                  uStack_168 = context->user->instPrimID[0];
                  uStack_164 = uStack_168;
                  uStack_160 = uStack_168;
                  uStack_15c = uStack_168;
                  *(float *)(ray + k * 4 + 0x80) = fVar183;
                  local_448 = *local_438;
                  local_3a8.valid = (int *)local_448;
                  local_3a8.geometryUserPtr = pGVar7->userPtr;
                  local_3a8.context = context->user;
                  local_3a8.ray = (RTCRayN *)ray;
                  local_3a8.hit = local_1e8;
                  local_3a8.N = 4;
                  local_378._0_4_ = (int)uVar65;
                  if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar7->occlusionFilterN)(&local_3a8);
                    uVar65 = (ulong)(uint)local_378._0_4_;
                  }
                  if (local_448 == (undefined1  [16])0x0) {
                    auVar83 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar83 = auVar83 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var10)(&local_3a8);
                      uVar65 = (ulong)(uint)local_378._0_4_;
                    }
                    auVar84 = vpcmpeqd_avx(local_448,_DAT_01f7aa10);
                    auVar83 = auVar84 ^ _DAT_01f7ae20;
                    auVar180._8_4_ = 0xff800000;
                    auVar180._0_8_ = 0xff800000ff800000;
                    auVar180._12_4_ = 0xff800000;
                    auVar84 = vblendvps_avx(auVar180,*(undefined1 (*) [16])(local_3a8.ray + 0x80),
                                            auVar84);
                    *(undefined1 (*) [16])(local_3a8.ray + 0x80) = auVar84;
                  }
                  auVar145._8_8_ = 0x100000001;
                  auVar145._0_8_ = 0x100000001;
                  bVar72 = (auVar145 & auVar83) != (undefined1  [16])0x0;
                  if (!bVar72) {
                    *(float *)(ray + k * 4 + 0x80) = fVar184;
                  }
                }
                uVar65 = CONCAT71((int7)(uVar65 >> 8),(byte)uVar65 | bVar72);
              }
            }
          }
          break;
        }
        lVar66 = lVar66 + -1;
      } while (lVar66 != 0);
      goto LAB_00f88fbe;
    }
    local_2e8 = vinsertps_avx(ZEXT416((uint)fVar185),ZEXT416((uint)fVar183),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }